

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  BBox1f BVar6;
  ushort uVar7;
  ushort uVar8;
  Geometry *pGVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  byte bVar25;
  uint uVar26;
  long lVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  RayHitK<8> *pRVar33;
  byte bVar34;
  ulong *puVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  uint uVar39;
  ulong uVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  long lVar52;
  float fVar53;
  float fVar107;
  float fVar108;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar109;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  vint4 ai;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  vint4 ai_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar128;
  vint4 bi;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar129;
  vint4 ai_6;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  vint4 bi_2;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  vint4 bi_7;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  float fVar157;
  float fVar158;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar163 [32];
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar167 [32];
  float fVar171;
  float fVar172;
  float fVar173;
  vint4 bi_3;
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  RTCFilterFunctionNArguments args;
  vfloat<4> dist;
  vfloat<4> tNear;
  vint<8> itime;
  vfloat<8> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1491;
  ulong local_1490;
  size_t local_1488;
  uint local_1480;
  uint local_147c;
  uint local_1478;
  uint local_1474;
  long local_1470;
  ulong local_1468;
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [16];
  long local_1428;
  long local_1420;
  ulong local_1418;
  ulong local_1410;
  ulong local_1408;
  ulong local_1400;
  ulong local_13f8;
  RayHitK<8> *local_13f0;
  ulong *local_13e8;
  long local_13e0;
  long local_13d8;
  Scene *local_13d0;
  ulong local_13c8;
  RTCFilterFunctionNArguments local_13c0;
  undefined1 local_1390 [8];
  float fStack_1388;
  float fStack_1384;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float local_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_1300 [32];
  undefined1 local_12d0 [16];
  float local_12c0;
  float fStack_12bc;
  float fStack_12b8;
  float fStack_12b4;
  float local_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  undefined1 local_1290 [16];
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 *local_1200;
  byte local_11f8;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  uint uStack_1164;
  float local_1160 [4];
  float fStack_1150;
  float fStack_114c;
  float fStack_1148;
  uint uStack_1144;
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  ulong local_f90 [492];
  ulong uVar40;
  undefined1 auVar56 [16];
  
  puVar35 = local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1440._4_4_ = uVar2;
  local_1440._0_4_ = uVar2;
  local_1440._8_4_ = uVar2;
  local_1440._12_4_ = uVar2;
  auVar147 = ZEXT1664(local_1440);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1460._4_4_ = uVar2;
  local_1460._0_4_ = uVar2;
  local_1460._8_4_ = uVar2;
  local_1460._12_4_ = uVar2;
  auVar143 = ZEXT1664(local_1460);
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1290._4_4_ = uVar2;
  local_1290._0_4_ = uVar2;
  local_1290._8_4_ = uVar2;
  local_1290._12_4_ = uVar2;
  auVar162 = ZEXT1664(local_1290);
  fVar129 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar53 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar107 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar128 = fVar129 * 0.99999964;
  fVar108 = fVar53 * 0.99999964;
  fVar109 = fVar107 * 0.99999964;
  local_1390._4_4_ = fVar109;
  local_1390._0_4_ = fVar109;
  fStack_1388 = fVar109;
  fStack_1384 = fVar109;
  auVar152 = ZEXT1664(_local_1390);
  fVar129 = fVar129 * 1.0000004;
  fVar53 = fVar53 * 1.0000004;
  fVar107 = fVar107 * 1.0000004;
  uVar46 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar50 = uVar46 ^ 0x10;
  uVar51 = uVar48 ^ 0x10;
  iVar3 = (tray->tnear).field_0.i[k];
  local_12d0._4_4_ = iVar3;
  local_12d0._0_4_ = iVar3;
  local_12d0._8_4_ = iVar3;
  local_12d0._12_4_ = iVar3;
  auVar174 = ZEXT1664(local_12d0);
  auVar54 = vbroadcastss_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar175 = ZEXT1664(auVar54);
  uVar45 = uVar41 ^ 0x10;
  local_1120 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fVar109 = fVar128;
  fVar110 = fVar128;
  fVar111 = fVar128;
  fVar112 = fVar108;
  fVar157 = fVar108;
  fVar158 = fVar108;
  fVar164 = fVar129;
  fVar165 = fVar129;
  fVar166 = fVar129;
  fVar168 = fVar53;
  fVar169 = fVar53;
  fVar170 = fVar53;
  fVar171 = fVar107;
  fVar172 = fVar107;
  fVar173 = fVar107;
  local_1490 = uVar45;
  local_1488 = k;
  local_1418 = uVar51;
  local_1410 = uVar50;
  local_1408 = uVar41;
  local_1400 = uVar48;
  local_13f8 = uVar46;
  local_13f0 = ray;
  local_1380 = fVar108;
  fStack_137c = fVar108;
  fStack_1378 = fVar108;
  fStack_1374 = fVar108;
  local_1370 = fVar128;
  fStack_136c = fVar128;
  fStack_1368 = fVar128;
  fStack_1364 = fVar128;
  local_12c0 = fVar107;
  fStack_12bc = fVar107;
  fStack_12b8 = fVar107;
  fStack_12b4 = fVar107;
  local_12b0 = fVar53;
  fStack_12ac = fVar53;
  fStack_12a8 = fVar53;
  fStack_12a4 = fVar53;
  local_12a0 = fVar129;
  fStack_129c = fVar129;
  fStack_1298 = fVar129;
  fStack_1294 = fVar129;
  do {
    local_1280 = auVar175._0_16_;
    while (pfVar1 = (float *)(puVar35 + -1), puVar35 = puVar35 + -2,
          *pfVar1 <= *(float *)(ray + k * 4 + 0x100)) {
      uVar49 = *puVar35;
joined_r0x0075d827:
      if ((uVar49 & 8) != 0) {
        local_1428 = (ulong)((uint)uVar49 & 0xf) - 8;
        if (local_1428 != 0) {
          uVar49 = uVar49 & 0xfffffffffffffff0;
          local_1420 = 0;
          local_13e8 = puVar35;
          do {
            local_1470 = local_1420 * 0x90;
            fVar128 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(uVar49 + 0x80 + local_1470)) *
                      *(float *)(uVar49 + 0x84 + local_1470);
            auVar54._8_8_ = 0;
            auVar54._0_8_ = *(ulong *)(uVar49 + 0x20 + local_1470);
            auVar126._8_8_ = 0;
            auVar126._0_8_ = *(ulong *)(uVar49 + 0x24 + local_1470);
            uVar22 = vpcmpub_avx512vl(auVar54,auVar126,2);
            auVar54 = vpmovzxbd_avx(auVar54);
            auVar54 = vcvtdq2ps_avx(auVar54);
            uVar2 = *(undefined4 *)(uVar49 + 0x44 + local_1470);
            auVar75._4_4_ = uVar2;
            auVar75._0_4_ = uVar2;
            auVar75._8_4_ = uVar2;
            auVar75._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar49 + 0x38 + local_1470);
            auVar138._4_4_ = uVar2;
            auVar138._0_4_ = uVar2;
            auVar138._8_4_ = uVar2;
            auVar138._12_4_ = uVar2;
            auVar74 = vfmadd213ps_fma(auVar54,auVar75,auVar138);
            auVar55._8_8_ = 0;
            auVar55._0_8_ = *(ulong *)(uVar49 + 0x50 + local_1470);
            auVar54 = vpmovzxbd_avx(auVar55);
            auVar54 = vcvtdq2ps_avx(auVar54);
            uVar2 = *(undefined4 *)(uVar49 + 0x74 + local_1470);
            auVar145._4_4_ = uVar2;
            auVar145._0_4_ = uVar2;
            auVar145._8_4_ = uVar2;
            auVar145._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar49 + 0x68 + local_1470);
            auVar148._4_4_ = uVar2;
            auVar148._0_4_ = uVar2;
            auVar148._8_4_ = uVar2;
            auVar148._12_4_ = uVar2;
            auVar54 = vfmadd213ps_fma(auVar54,auVar145,auVar148);
            auVar115._4_4_ = fVar128;
            auVar115._0_4_ = fVar128;
            auVar115._8_4_ = fVar128;
            auVar115._12_4_ = fVar128;
            auVar54 = vsubps_avx(auVar54,auVar74);
            auVar74 = vfmadd213ps_fma(auVar54,auVar115,auVar74);
            auVar54 = vpmovzxbd_avx(auVar126);
            auVar54 = vcvtdq2ps_avx(auVar54);
            auVar55 = vfmadd213ps_fma(auVar54,auVar75,auVar138);
            auVar127._8_8_ = 0;
            auVar127._0_8_ = *(ulong *)(uVar49 + 0x54 + local_1470);
            auVar54 = vpmovzxbd_avx(auVar127);
            auVar54 = vcvtdq2ps_avx(auVar54);
            auVar54 = vfmadd213ps_fma(auVar54,auVar145,auVar148);
            auVar54 = vsubps_avx(auVar54,auVar55);
            auVar55 = vfmadd213ps_fma(auVar54,auVar115,auVar55);
            auVar132._8_8_ = 0;
            auVar132._0_8_ = *(ulong *)(uVar49 + 0x28 + local_1470);
            auVar54 = vpmovzxbd_avx(auVar132);
            auVar54 = vcvtdq2ps_avx(auVar54);
            uVar2 = *(undefined4 *)(uVar49 + 0x48 + local_1470);
            auVar76._4_4_ = uVar2;
            auVar76._0_4_ = uVar2;
            auVar76._8_4_ = uVar2;
            auVar76._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar49 + 0x3c + local_1470);
            auVar139._4_4_ = uVar2;
            auVar139._0_4_ = uVar2;
            auVar139._8_4_ = uVar2;
            auVar139._12_4_ = uVar2;
            auVar56 = vfmadd213ps_fma(auVar54,auVar76,auVar139);
            auVar146._8_8_ = 0;
            auVar146._0_8_ = *(ulong *)(uVar49 + 0x58 + local_1470);
            auVar54 = vpmovzxbd_avx(auVar146);
            uVar2 = *(undefined4 *)(uVar49 + 0x78 + local_1470);
            auVar149._4_4_ = uVar2;
            auVar149._0_4_ = uVar2;
            auVar149._8_4_ = uVar2;
            auVar149._12_4_ = uVar2;
            auVar54 = vcvtdq2ps_avx(auVar54);
            uVar2 = *(undefined4 *)(uVar49 + 0x6c + local_1470);
            auVar153._4_4_ = uVar2;
            auVar153._0_4_ = uVar2;
            auVar153._8_4_ = uVar2;
            auVar153._12_4_ = uVar2;
            auVar54 = vfmadd213ps_fma(auVar54,auVar149,auVar153);
            auVar54 = vsubps_avx(auVar54,auVar56);
            auVar56 = vfmadd213ps_fma(auVar54,auVar115,auVar56);
            auVar69._8_8_ = 0;
            auVar69._0_8_ = *(ulong *)(uVar49 + 0x2c + local_1470);
            auVar54 = vpmovzxbd_avx(auVar69);
            auVar54 = vcvtdq2ps_avx(auVar54);
            auVar126 = vfmadd213ps_fma(auVar54,auVar76,auVar139);
            auVar155._8_8_ = 0;
            auVar155._0_8_ = *(ulong *)(uVar49 + 0x5c + local_1470);
            auVar54 = vpmovzxbd_avx(auVar155);
            auVar54 = vcvtdq2ps_avx(auVar54);
            auVar54 = vfmadd213ps_fma(auVar54,auVar149,auVar153);
            auVar54 = vsubps_avx(auVar54,auVar126);
            auVar126 = vfmadd213ps_fma(auVar54,auVar115,auVar126);
            auVar71._8_8_ = 0;
            auVar71._0_8_ = *(ulong *)(uVar49 + 0x30 + local_1470);
            auVar54 = vpmovzxbd_avx(auVar71);
            auVar54 = vcvtdq2ps_avx(auVar54);
            uVar2 = *(undefined4 *)(uVar49 + 0x4c + local_1470);
            auVar140._4_4_ = uVar2;
            auVar140._0_4_ = uVar2;
            auVar140._8_4_ = uVar2;
            auVar140._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar49 + 0x40 + local_1470);
            auVar150._4_4_ = uVar2;
            auVar150._0_4_ = uVar2;
            auVar150._8_4_ = uVar2;
            auVar150._12_4_ = uVar2;
            auVar127 = vfmadd213ps_fma(auVar54,auVar140,auVar150);
            auVar154._8_8_ = 0;
            auVar154._0_8_ = *(ulong *)(uVar49 + 0x60 + local_1470);
            auVar54 = vpmovzxbd_avx(auVar154);
            auVar54 = vcvtdq2ps_avx(auVar54);
            uVar2 = *(undefined4 *)(uVar49 + 0x7c + local_1470);
            auVar156._4_4_ = uVar2;
            auVar156._0_4_ = uVar2;
            auVar156._8_4_ = uVar2;
            auVar156._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(uVar49 + 0x70 + local_1470);
            auVar159._4_4_ = uVar2;
            auVar159._0_4_ = uVar2;
            auVar159._8_4_ = uVar2;
            auVar159._12_4_ = uVar2;
            auVar54 = vfmadd213ps_fma(auVar54,auVar156,auVar159);
            auVar54 = vsubps_avx(auVar54,auVar127);
            auVar127 = vfmadd213ps_fma(auVar54,auVar115,auVar127);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = *(ulong *)(uVar49 + 0x34 + local_1470);
            auVar54 = vpmovzxbd_avx(auVar72);
            auVar54 = vcvtdq2ps_avx(auVar54);
            auVar132 = vfmadd213ps_fma(auVar54,auVar140,auVar150);
            auVar141._8_8_ = 0;
            auVar141._0_8_ = *(ulong *)(uVar49 + 100 + local_1470);
            auVar54 = vpmovzxbd_avx(auVar141);
            auVar54 = vcvtdq2ps_avx(auVar54);
            auVar54 = vfmadd213ps_fma(auVar54,auVar156,auVar159);
            auVar54 = vsubps_avx(auVar54,auVar132);
            auVar132 = vfmadd213ps_fma(auVar54,auVar115,auVar132);
            auVar54 = vsubps_avx(auVar74,local_1440);
            auVar78._0_4_ = auVar54._0_4_ * local_1370;
            auVar78._4_4_ = auVar54._4_4_ * fStack_136c;
            auVar78._8_4_ = auVar54._8_4_ * fStack_1368;
            auVar78._12_4_ = auVar54._12_4_ * fStack_1364;
            auVar54 = vsubps_avx(auVar56,local_1460);
            auVar56._0_4_ = auVar54._0_4_ * local_1380;
            auVar56._4_4_ = auVar54._4_4_ * fStack_137c;
            auVar56._8_4_ = auVar54._8_4_ * fStack_1378;
            auVar56._12_4_ = auVar54._12_4_ * fStack_1374;
            auVar54 = vsubps_avx(auVar127,auVar162._0_16_);
            auVar73._0_4_ = auVar54._0_4_ * (float)local_1390._0_4_;
            auVar73._4_4_ = auVar54._4_4_ * (float)local_1390._4_4_;
            auVar73._8_4_ = auVar54._8_4_ * fStack_1388;
            auVar73._12_4_ = auVar54._12_4_ * fStack_1384;
            auVar54 = vsubps_avx(auVar55,local_1440);
            auVar70._0_4_ = fVar129 * auVar54._0_4_;
            auVar70._4_4_ = fVar164 * auVar54._4_4_;
            auVar70._8_4_ = fVar165 * auVar54._8_4_;
            auVar70._12_4_ = fVar166 * auVar54._12_4_;
            auVar54 = vsubps_avx(auVar126,local_1460);
            auVar77._0_4_ = fVar53 * auVar54._0_4_;
            auVar77._4_4_ = fVar168 * auVar54._4_4_;
            auVar77._8_4_ = fVar169 * auVar54._8_4_;
            auVar77._12_4_ = fVar170 * auVar54._12_4_;
            auVar54 = vsubps_avx(auVar132,auVar162._0_16_);
            auVar142._0_4_ = fVar107 * auVar54._0_4_;
            auVar142._4_4_ = fVar171 * auVar54._4_4_;
            auVar142._8_4_ = fVar172 * auVar54._8_4_;
            auVar142._12_4_ = fVar173 * auVar54._12_4_;
            auVar74 = vpminsd_avx(auVar78,auVar70);
            auVar54 = vpmaxsd_avx(auVar78,auVar70);
            auVar55 = vpminsd_avx(auVar56,auVar77);
            auVar74 = vpmaxsd_avx(auVar74,auVar55);
            auVar55 = vpmaxsd_avx(auVar56,auVar77);
            auVar56 = vpminsd_avx(auVar54,auVar55);
            auVar55 = vpminsd_avx(auVar73,auVar142);
            auVar54 = vpmaxsd_avx(auVar73,auVar142);
            auVar55 = vpmaxsd_avx(auVar55,auVar174._0_16_);
            local_1270 = vpmaxsd_avx(auVar74,auVar55);
            auVar54 = vpminsd_avx512vl(auVar54,auVar175._0_16_);
            auVar54 = vpminsd_avx(auVar56,auVar54);
            local_13c8 = vpcmpd_avx512vl(local_1270,auVar54,2);
            local_13c8 = ((byte)uVar22 & 0xf) & local_13c8;
            if ((char)local_13c8 != '\0') {
              local_1470 = local_1470 + uVar49;
              do {
                pRVar33 = local_13f0;
                lVar27 = 0;
                for (uVar38 = local_13c8; (uVar38 & 1) == 0;
                    uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                  lVar27 = lVar27 + 1;
                }
                fVar128 = *(float *)(ray + k * 4 + 0x100);
                if (*(float *)(local_1270 + lVar27 * 4) <= fVar128) {
                  uVar7 = *(ushort *)(local_1470 + lVar27 * 8);
                  local_1478 = (uint)uVar7;
                  uVar8 = *(ushort *)(local_1470 + 2 + lVar27 * 8);
                  local_1474 = (uint)uVar8;
                  uVar39 = *(uint *)(local_1470 + 0x88);
                  uVar37 = *(uint *)(local_1470 + 4 + lVar27 * 8);
                  local_1468 = (ulong)uVar37;
                  local_13d0 = context->scene;
                  pGVar9 = (local_13d0->geometries).items[uVar39].ptr;
                  local_13d8 = *(long *)&pGVar9->field_0x58;
                  BVar6 = pGVar9->time_range;
                  auVar74._8_8_ = 0;
                  auVar74._0_4_ = BVar6.lower;
                  auVar74._4_4_ = BVar6.upper;
                  fVar129 = BVar6.lower;
                  auVar103._4_4_ = fVar129;
                  auVar103._0_4_ = fVar129;
                  auVar103._8_4_ = fVar129;
                  auVar103._12_4_ = fVar129;
                  auVar103._16_4_ = fVar129;
                  auVar103._20_4_ = fVar129;
                  auVar103._24_4_ = fVar129;
                  auVar103._28_4_ = fVar129;
                  fVar129 = pGVar9->fnumTimeSegments;
                  auVar103 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar103);
                  auVar54 = vmovshdup_avx(auVar74);
                  auVar54 = vsubps_avx(auVar54,auVar74);
                  auVar83._0_4_ = auVar54._0_4_;
                  auVar83._4_4_ = auVar83._0_4_;
                  auVar83._8_4_ = auVar83._0_4_;
                  auVar83._12_4_ = auVar83._0_4_;
                  auVar83._16_4_ = auVar83._0_4_;
                  auVar83._20_4_ = auVar83._0_4_;
                  auVar83._24_4_ = auVar83._0_4_;
                  auVar83._28_4_ = auVar83._0_4_;
                  auVar103 = vdivps_avx(auVar103,auVar83);
                  auVar100._4_4_ = fVar129 * auVar103._4_4_;
                  auVar100._0_4_ = fVar129 * auVar103._0_4_;
                  auVar100._8_4_ = fVar129 * auVar103._8_4_;
                  auVar100._12_4_ = fVar129 * auVar103._12_4_;
                  auVar100._16_4_ = fVar129 * auVar103._16_4_;
                  auVar100._20_4_ = fVar129 * auVar103._20_4_;
                  auVar100._24_4_ = fVar129 * auVar103._24_4_;
                  auVar100._28_4_ = auVar103._28_4_;
                  auVar103 = vroundps_avx(auVar100,1);
                  fVar129 = fVar129 + -1.0;
                  auVar82._4_4_ = fVar129;
                  auVar82._0_4_ = fVar129;
                  auVar82._8_4_ = fVar129;
                  auVar82._12_4_ = fVar129;
                  auVar82._16_4_ = fVar129;
                  auVar82._20_4_ = fVar129;
                  auVar82._24_4_ = fVar129;
                  auVar82._28_4_ = fVar129;
                  auVar103 = vminps_avx(auVar103,auVar82);
                  auVar103 = vmaxps_avx(auVar103,_DAT_01faff00);
                  local_10e0 = vsubps_avx(auVar100,auVar103);
                  local_1100 = vcvtps2dq_avx(auVar103);
                  local_13e0 = pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_1468;
                  local_147c = local_1478 & 0x7fff;
                  local_1480 = local_1474 & 0x7fff;
                  uVar36 = *(uint *)(local_13d8 + 4 + local_13e0);
                  uVar41 = (ulong)uVar36;
                  uVar46 = (ulong)(uVar36 * local_1480 +
                                  *(int *)(local_13d8 + local_13e0) + local_147c);
                  lVar10 = *(long *)&pGVar9[2].numPrimitives;
                  lVar47 = (long)*(int *)(local_1100 + k * 4) * 0x38;
                  lVar11 = *(long *)(lVar10 + 0x10 + lVar47);
                  lVar12 = *(long *)(lVar10 + lVar47);
                  auVar54 = *(undefined1 (*) [16])(lVar12 + lVar11 * uVar46);
                  lVar13 = *(long *)(lVar10 + 0x48 + lVar47);
                  auVar74 = *(undefined1 (*) [16])(lVar12 + (uVar46 + 1) * lVar11);
                  lVar27 = uVar46 + uVar41;
                  auVar55 = *(undefined1 (*) [16])(lVar12 + lVar27 * lVar11);
                  lVar42 = uVar46 + uVar41 + 1;
                  auVar56 = *(undefined1 (*) [16])(lVar12 + lVar42 * lVar11);
                  uVar45 = (ulong)(-1 < (short)uVar7);
                  lVar43 = uVar46 + uVar45 + 1;
                  auVar126 = *(undefined1 (*) [16])(lVar12 + lVar43 * lVar11);
                  lVar52 = uVar45 + lVar42;
                  auVar127 = *(undefined1 (*) [16])(lVar12 + lVar52 * lVar11);
                  uVar45 = 0;
                  if (-1 < (short)uVar8) {
                    uVar45 = uVar41;
                  }
                  auVar132 = *(undefined1 (*) [16])(lVar12 + (lVar27 + uVar45) * lVar11);
                  auVar115 = *(undefined1 (*) [16])(lVar12 + (lVar42 + uVar45) * lVar11);
                  auVar78 = *(undefined1 (*) [16])(lVar12 + lVar11 * (uVar45 + lVar52));
                  lVar10 = *(long *)(lVar10 + 0x38 + lVar47);
                  auVar69 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_10e0 + local_1488 * 4)));
                  auVar70 = vsubps_avx(*(undefined1 (*) [16])(lVar10 + lVar13 * uVar46),auVar54);
                  auVar70 = vfmadd213ps_avx512vl(auVar70,auVar69,auVar54);
                  auVar54 = vsubps_avx(*(undefined1 (*) [16])(lVar10 + lVar13 * (uVar46 + 1)),
                                       auVar74);
                  auVar71 = vfmadd213ps_avx512vl(auVar54,auVar69,auVar74);
                  auVar54 = vsubps_avx(*(undefined1 (*) [16])(lVar10 + lVar13 * lVar27),auVar55);
                  auVar72 = vfmadd213ps_avx512vl(auVar54,auVar69,auVar55);
                  auVar54 = vsubps_avx(*(undefined1 (*) [16])(lVar10 + lVar13 * lVar42),auVar56);
                  auVar73 = vfmadd213ps_avx512vl(auVar54,auVar69,auVar56);
                  auVar54 = vsubps_avx(*(undefined1 (*) [16])(lVar10 + lVar13 * lVar43),auVar126);
                  auVar74 = vfmadd213ps_avx512vl(auVar54,auVar69,auVar126);
                  auVar54 = vsubps_avx(*(undefined1 (*) [16])(lVar10 + lVar13 * lVar52),auVar127);
                  auVar75 = vfmadd213ps_avx512vl(auVar54,auVar69,auVar127);
                  auVar54 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar10 + lVar13 * (lVar27 + uVar45)),auVar132);
                  auVar76 = vfmadd213ps_avx512vl(auVar54,auVar69,auVar132);
                  auVar54 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar10 + lVar13 * (lVar42 + uVar45)),auVar115);
                  auVar77 = vfmadd213ps_avx512vl(auVar54,auVar69,auVar115);
                  auVar54 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar10 + (uVar45 + lVar52) * lVar13),auVar78);
                  auVar78 = vfmadd213ps_avx512vl(auVar54,auVar69,auVar78);
                  auVar55 = vunpcklps_avx(auVar71,auVar75);
                  auVar54 = vunpckhps_avx(auVar71,auVar75);
                  auVar56 = vunpcklps_avx(auVar74,auVar73);
                  auVar74 = vunpckhps_avx(auVar74,auVar73);
                  auVar126 = vunpcklps_avx(auVar54,auVar74);
                  auVar127 = vunpcklps_avx(auVar55,auVar56);
                  auVar54 = vunpckhps_avx(auVar55,auVar56);
                  auVar56 = vunpcklps_avx(auVar72,auVar77);
                  auVar74 = vunpckhps_avx(auVar72,auVar77);
                  auVar132 = vunpcklps_avx(auVar73,auVar76);
                  auVar55 = vunpckhps_avx(auVar73,auVar76);
                  auVar55 = vunpcklps_avx(auVar74,auVar55);
                  auVar115 = vunpcklps_avx(auVar56,auVar132);
                  auVar74 = vunpckhps_avx(auVar56,auVar132);
                  auVar87._16_16_ = auVar77;
                  auVar87._0_16_ = auVar72;
                  auVar85._16_16_ = auVar75;
                  auVar85._0_16_ = auVar71;
                  auVar103 = vunpcklps_avx(auVar85,auVar87);
                  auVar92._16_16_ = auVar73;
                  auVar92._0_16_ = auVar70;
                  auVar89._16_16_ = auVar78;
                  auVar89._0_16_ = auVar73;
                  auVar100 = vunpcklps_avx(auVar92,auVar89);
                  auVar82 = vunpcklps_avx(auVar100,auVar103);
                  auVar100 = vunpckhps_avx(auVar100,auVar103);
                  auVar103 = vunpckhps_avx(auVar85,auVar87);
                  auVar83 = vunpckhps_avx(auVar92,auVar89);
                  auVar83 = vunpcklps_avx(auVar83,auVar103);
                  auVar88._16_16_ = auVar127;
                  auVar88._0_16_ = auVar127;
                  auVar90._16_16_ = auVar54;
                  auVar90._0_16_ = auVar54;
                  auVar91._16_16_ = auVar126;
                  auVar91._0_16_ = auVar126;
                  auVar93._16_16_ = auVar115;
                  auVar93._0_16_ = auVar115;
                  auVar94._16_16_ = auVar74;
                  auVar94._0_16_ = auVar74;
                  uVar2 = *(undefined4 *)(local_13f0 + local_1488 * 4);
                  auVar95._4_4_ = uVar2;
                  auVar95._0_4_ = uVar2;
                  auVar95._8_4_ = uVar2;
                  auVar95._12_4_ = uVar2;
                  auVar95._16_4_ = uVar2;
                  auVar95._20_4_ = uVar2;
                  auVar95._24_4_ = uVar2;
                  auVar95._28_4_ = uVar2;
                  auVar79 = vbroadcastss_avx512vl
                                      (ZEXT416(*(uint *)(local_13f0 + local_1488 * 4 + 0x20)));
                  auVar80 = vbroadcastss_avx512vl
                                      (ZEXT416(*(uint *)(local_13f0 + local_1488 * 4 + 0x40)));
                  uVar2 = *(undefined4 *)(local_13f0 + local_1488 * 4 + 0x80);
                  auVar151._4_4_ = uVar2;
                  auVar151._0_4_ = uVar2;
                  auVar151._8_4_ = uVar2;
                  auVar151._12_4_ = uVar2;
                  auVar151._16_4_ = uVar2;
                  auVar151._20_4_ = uVar2;
                  auVar151._24_4_ = uVar2;
                  auVar151._28_4_ = uVar2;
                  auVar81 = vinsertf32x4_avx512vl(ZEXT1632(auVar55),auVar55,1);
                  uVar2 = *(undefined4 *)(local_13f0 + local_1488 * 4 + 0xa0);
                  auVar160._4_4_ = uVar2;
                  auVar160._0_4_ = uVar2;
                  auVar160._8_4_ = uVar2;
                  auVar160._12_4_ = uVar2;
                  auVar160._16_4_ = uVar2;
                  auVar160._20_4_ = uVar2;
                  auVar160._24_4_ = uVar2;
                  auVar160._28_4_ = uVar2;
                  fVar129 = *(float *)(local_13f0 + local_1488 * 4 + 0xc0);
                  auVar163._4_4_ = fVar129;
                  auVar163._0_4_ = fVar129;
                  auVar163._8_4_ = fVar129;
                  auVar163._12_4_ = fVar129;
                  auVar163._16_4_ = fVar129;
                  auVar163._20_4_ = fVar129;
                  auVar163._24_4_ = fVar129;
                  auVar163._28_4_ = fVar129;
                  auVar103 = vsubps_avx(auVar82,auVar95);
                  auVar82 = vsubps_avx512vl(auVar100,auVar79);
                  auVar83 = vsubps_avx512vl(auVar83,auVar80);
                  auVar100 = vsubps_avx(auVar88,auVar95);
                  auVar84 = vsubps_avx512vl(auVar90,auVar79);
                  auVar85 = vsubps_avx512vl(auVar91,auVar80);
                  auVar86 = vsubps_avx512vl(auVar93,auVar95);
                  auVar79 = vsubps_avx512vl(auVar94,auVar79);
                  auVar80 = vsubps_avx512vl(auVar81,auVar80);
                  auVar87 = vsubps_avx512vl(auVar86,auVar103);
                  auVar88 = vsubps_avx512vl(auVar79,auVar82);
                  auVar89 = vsubps_avx512vl(auVar80,auVar83);
                  auVar90 = vsubps_avx512vl(auVar103,auVar100);
                  auVar91 = vsubps_avx512vl(auVar82,auVar84);
                  auVar92 = vsubps_avx512vl(auVar83,auVar85);
                  auVar93 = vsubps_avx512vl(auVar100,auVar86);
                  auVar94 = vsubps_avx512vl(auVar84,auVar79);
                  auVar95 = vsubps_avx512vl(auVar85,auVar80);
                  auVar81 = vaddps_avx512vl(auVar86,auVar103);
                  auVar96 = vaddps_avx512vl(auVar79,auVar82);
                  auVar97 = vaddps_avx512vl(auVar80,auVar83);
                  auVar98 = vmulps_avx512vl(auVar96,auVar89);
                  auVar98 = vfmsub231ps_avx512vl(auVar98,auVar88,auVar97);
                  auVar97 = vmulps_avx512vl(auVar97,auVar87);
                  auVar97 = vfmsub231ps_avx512vl(auVar97,auVar89,auVar81);
                  auVar81 = vmulps_avx512vl(auVar81,auVar88);
                  auVar54 = vfmsub231ps_fma(auVar81,auVar87,auVar96);
                  auVar99._0_4_ = auVar54._0_4_ * fVar129;
                  auVar99._4_4_ = auVar54._4_4_ * fVar129;
                  auVar99._8_4_ = auVar54._8_4_ * fVar129;
                  auVar99._12_4_ = auVar54._12_4_ * fVar129;
                  auVar99._16_4_ = fVar129 * 0.0;
                  auVar99._20_4_ = fVar129 * 0.0;
                  auVar99._24_4_ = fVar129 * 0.0;
                  auVar99._28_4_ = 0;
                  auVar81 = vfmadd231ps_avx512vl(auVar99,auVar160,auVar97);
                  auVar97 = vfmadd231ps_avx512vl(auVar81,auVar151,auVar98);
                  auVar167._0_4_ = auVar103._0_4_ + auVar100._0_4_;
                  auVar167._4_4_ = auVar103._4_4_ + auVar100._4_4_;
                  auVar167._8_4_ = auVar103._8_4_ + auVar100._8_4_;
                  auVar167._12_4_ = auVar103._12_4_ + auVar100._12_4_;
                  auVar167._16_4_ = auVar103._16_4_ + auVar100._16_4_;
                  auVar167._20_4_ = auVar103._20_4_ + auVar100._20_4_;
                  auVar167._24_4_ = auVar103._24_4_ + auVar100._24_4_;
                  auVar167._28_4_ = auVar103._28_4_ + auVar100._28_4_;
                  auVar81 = vaddps_avx512vl(auVar82,auVar84);
                  auVar96 = vaddps_avx512vl(auVar83,auVar85);
                  auVar98 = vmulps_avx512vl(auVar81,auVar92);
                  auVar98 = vfmsub231ps_avx512vl(auVar98,auVar91,auVar96);
                  auVar96 = vmulps_avx512vl(auVar96,auVar90);
                  auVar99 = vfmsub231ps_avx512vl(auVar96,auVar92,auVar167);
                  auVar96 = vmulps_avx512vl(auVar167,auVar91);
                  auVar81 = vfmsub231ps_avx512vl(auVar96,auVar90,auVar81);
                  auVar96._4_4_ = auVar81._4_4_ * fVar129;
                  auVar96._0_4_ = auVar81._0_4_ * fVar129;
                  auVar96._8_4_ = auVar81._8_4_ * fVar129;
                  auVar96._12_4_ = auVar81._12_4_ * fVar129;
                  auVar96._16_4_ = auVar81._16_4_ * fVar129;
                  auVar96._20_4_ = auVar81._20_4_ * fVar129;
                  auVar96._24_4_ = auVar81._24_4_ * fVar129;
                  auVar96._28_4_ = auVar81._28_4_;
                  auVar81 = vfmadd231ps_avx512vl(auVar96,auVar160,auVar99);
                  auVar96 = vfmadd231ps_avx512vl(auVar81,auVar151,auVar98);
                  auVar100 = vaddps_avx512vl(auVar100,auVar86);
                  auVar79 = vaddps_avx512vl(auVar84,auVar79);
                  auVar80 = vaddps_avx512vl(auVar85,auVar80);
                  auVar81 = vmulps_avx512vl(auVar79,auVar95);
                  auVar81 = vfmsub231ps_avx512vl(auVar81,auVar94,auVar80);
                  auVar80 = vmulps_avx512vl(auVar80,auVar93);
                  auVar80 = vfmsub231ps_avx512vl(auVar80,auVar95,auVar100);
                  auVar84._4_4_ = auVar100._4_4_ * auVar94._4_4_;
                  auVar84._0_4_ = auVar100._0_4_ * auVar94._0_4_;
                  auVar84._8_4_ = auVar100._8_4_ * auVar94._8_4_;
                  auVar84._12_4_ = auVar100._12_4_ * auVar94._12_4_;
                  auVar84._16_4_ = auVar100._16_4_ * auVar94._16_4_;
                  auVar84._20_4_ = auVar100._20_4_ * auVar94._20_4_;
                  auVar84._24_4_ = auVar100._24_4_ * auVar94._24_4_;
                  auVar84._28_4_ = auVar100._28_4_;
                  auVar54 = vfmsub231ps_fma(auVar84,auVar93,auVar79);
                  auVar100 = vmulps_avx512vl(ZEXT1632(auVar54),auVar163);
                  auVar100 = vfmadd231ps_avx512vl(auVar100,auVar160,auVar80);
                  auVar100 = vfmadd231ps_avx512vl(auVar100,auVar151,auVar81);
                  auVar86._0_4_ = auVar97._0_4_ + auVar96._0_4_;
                  auVar86._4_4_ = auVar97._4_4_ + auVar96._4_4_;
                  auVar86._8_4_ = auVar97._8_4_ + auVar96._8_4_;
                  auVar86._12_4_ = auVar97._12_4_ + auVar96._12_4_;
                  auVar86._16_4_ = auVar97._16_4_ + auVar96._16_4_;
                  auVar86._20_4_ = auVar97._20_4_ + auVar96._20_4_;
                  auVar86._24_4_ = auVar97._24_4_ + auVar96._24_4_;
                  auVar86._28_4_ = auVar97._28_4_ + auVar96._28_4_;
                  local_1220 = vaddps_avx512vl(auVar100,auVar86);
                  auVar79._8_4_ = 0x7fffffff;
                  auVar79._0_8_ = 0x7fffffff7fffffff;
                  auVar79._12_4_ = 0x7fffffff;
                  auVar79._16_4_ = 0x7fffffff;
                  auVar79._20_4_ = 0x7fffffff;
                  auVar79._24_4_ = 0x7fffffff;
                  auVar79._28_4_ = 0x7fffffff;
                  vandps_avx512vl(local_1220,auVar79);
                  auVar80._8_4_ = 0x34000000;
                  auVar80._0_8_ = 0x3400000034000000;
                  auVar80._12_4_ = 0x34000000;
                  auVar80._16_4_ = 0x34000000;
                  auVar80._20_4_ = 0x34000000;
                  auVar80._24_4_ = 0x34000000;
                  auVar80._28_4_ = 0x34000000;
                  auVar79 = vmulps_avx512vl(local_1220,auVar80);
                  auVar80 = vminps_avx512vl(auVar97,auVar96);
                  auVar80 = vminps_avx512vl(auVar80,auVar100);
                  auVar81._8_4_ = 0x80000000;
                  auVar81._0_8_ = 0x8000000080000000;
                  auVar81._12_4_ = 0x80000000;
                  auVar81._16_4_ = 0x80000000;
                  auVar81._20_4_ = 0x80000000;
                  auVar81._24_4_ = 0x80000000;
                  auVar81._28_4_ = 0x80000000;
                  auVar81 = vxorps_avx512vl(auVar79,auVar81);
                  uVar22 = vcmpps_avx512vl(auVar80,auVar81,5);
                  auVar80 = vmaxps_avx512vl(auVar97,auVar96);
                  auVar100 = vmaxps_avx512vl(auVar80,auVar100);
                  uVar24 = vcmpps_avx512vl(auVar100,auVar79,2);
                  bVar25 = (byte)uVar22 | (byte)uVar24;
                  k = local_1488;
                  if (bVar25 != 0) {
                    auVar100 = vmulps_avx512vl(auVar91,auVar89);
                    auVar79 = vmulps_avx512vl(auVar87,auVar92);
                    auVar80 = vmulps_avx512vl(auVar90,auVar88);
                    auVar81 = vmulps_avx512vl(auVar94,auVar92);
                    auVar84 = vmulps_avx512vl(auVar90,auVar95);
                    auVar85 = vmulps_avx512vl(auVar93,auVar91);
                    auVar86 = vfmsub213ps_avx512vl(auVar88,auVar92,auVar100);
                    auVar88 = vfmsub213ps_avx512vl(auVar89,auVar90,auVar79);
                    auVar87 = vfmsub213ps_avx512vl(auVar87,auVar91,auVar80);
                    auVar89 = vfmsub213ps_avx512vl(auVar95,auVar91,auVar81);
                    auVar91 = vfmsub213ps_avx512vl(auVar93,auVar92,auVar84);
                    auVar90 = vfmsub213ps_avx512vl(auVar94,auVar90,auVar85);
                    auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    vandps_avx512vl(auVar100,auVar92);
                    vandps_avx512vl(auVar81,auVar92);
                    uVar45 = vcmpps_avx512vl(auVar92,auVar92,1);
                    vandps_avx512vl(auVar79,auVar92);
                    vandps_avx512vl(auVar84,auVar92);
                    uVar41 = vcmpps_avx512vl(auVar92,auVar92,1);
                    vandps_avx512vl(auVar80,auVar92);
                    vandps_avx512vl(auVar85,auVar92);
                    uVar46 = vcmpps_avx512vl(auVar92,auVar92,1);
                    bVar15 = (bool)((byte)uVar45 & 1);
                    auVar101._0_4_ =
                         (float)((uint)bVar15 * auVar86._0_4_ | (uint)!bVar15 * auVar89._0_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 1) & 1);
                    auVar101._4_4_ =
                         (float)((uint)bVar15 * auVar86._4_4_ | (uint)!bVar15 * auVar89._4_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 2) & 1);
                    auVar101._8_4_ =
                         (float)((uint)bVar15 * auVar86._8_4_ | (uint)!bVar15 * auVar89._8_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 3) & 1);
                    auVar101._12_4_ =
                         (float)((uint)bVar15 * auVar86._12_4_ | (uint)!bVar15 * auVar89._12_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 4) & 1);
                    auVar101._16_4_ =
                         (float)((uint)bVar15 * auVar86._16_4_ | (uint)!bVar15 * auVar89._16_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 5) & 1);
                    auVar101._20_4_ =
                         (float)((uint)bVar15 * auVar86._20_4_ | (uint)!bVar15 * auVar89._20_4_);
                    bVar15 = (bool)((byte)(uVar45 >> 6) & 1);
                    auVar101._24_4_ =
                         (float)((uint)bVar15 * auVar86._24_4_ | (uint)!bVar15 * auVar89._24_4_);
                    bVar15 = SUB81(uVar45 >> 7,0);
                    auVar101._28_4_ = (uint)bVar15 * auVar86._28_4_ | (uint)!bVar15 * auVar89._28_4_
                    ;
                    bVar15 = (bool)((byte)uVar41 & 1);
                    auVar102._0_4_ =
                         (float)((uint)bVar15 * auVar88._0_4_ | (uint)!bVar15 * auVar91._0_4_);
                    bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
                    auVar102._4_4_ =
                         (float)((uint)bVar15 * auVar88._4_4_ | (uint)!bVar15 * auVar91._4_4_);
                    bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
                    auVar102._8_4_ =
                         (float)((uint)bVar15 * auVar88._8_4_ | (uint)!bVar15 * auVar91._8_4_);
                    bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
                    auVar102._12_4_ =
                         (float)((uint)bVar15 * auVar88._12_4_ | (uint)!bVar15 * auVar91._12_4_);
                    bVar15 = (bool)((byte)(uVar41 >> 4) & 1);
                    auVar102._16_4_ =
                         (float)((uint)bVar15 * auVar88._16_4_ | (uint)!bVar15 * auVar91._16_4_);
                    bVar15 = (bool)((byte)(uVar41 >> 5) & 1);
                    auVar102._20_4_ =
                         (float)((uint)bVar15 * auVar88._20_4_ | (uint)!bVar15 * auVar91._20_4_);
                    bVar15 = (bool)((byte)(uVar41 >> 6) & 1);
                    auVar102._24_4_ =
                         (float)((uint)bVar15 * auVar88._24_4_ | (uint)!bVar15 * auVar91._24_4_);
                    bVar15 = SUB81(uVar41 >> 7,0);
                    auVar102._28_4_ = (uint)bVar15 * auVar88._28_4_ | (uint)!bVar15 * auVar91._28_4_
                    ;
                    bVar15 = (bool)((byte)uVar46 & 1);
                    fVar53 = (float)((uint)bVar15 * auVar87._0_4_ | (uint)!bVar15 * auVar90._0_4_);
                    bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
                    fVar107 = (float)((uint)bVar15 * auVar87._4_4_ | (uint)!bVar15 * auVar90._4_4_);
                    bVar15 = (bool)((byte)(uVar46 >> 2) & 1);
                    fVar108 = (float)((uint)bVar15 * auVar87._8_4_ | (uint)!bVar15 * auVar90._8_4_);
                    bVar15 = (bool)((byte)(uVar46 >> 3) & 1);
                    fVar109 = (float)((uint)bVar15 * auVar87._12_4_ | (uint)!bVar15 * auVar90._12_4_
                                     );
                    bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
                    fVar110 = (float)((uint)bVar15 * auVar87._16_4_ | (uint)!bVar15 * auVar90._16_4_
                                     );
                    bVar15 = (bool)((byte)(uVar46 >> 5) & 1);
                    fVar111 = (float)((uint)bVar15 * auVar87._20_4_ | (uint)!bVar15 * auVar90._20_4_
                                     );
                    bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                    fVar112 = (float)((uint)bVar15 * auVar87._24_4_ | (uint)!bVar15 * auVar90._24_4_
                                     );
                    bVar15 = SUB81(uVar46 >> 7,0);
                    auVar29._4_4_ = fVar129 * fVar107;
                    auVar29._0_4_ = fVar129 * fVar53;
                    auVar29._8_4_ = fVar129 * fVar108;
                    auVar29._12_4_ = fVar129 * fVar109;
                    auVar29._16_4_ = fVar129 * fVar110;
                    auVar29._20_4_ = fVar129 * fVar111;
                    auVar29._24_4_ = fVar129 * fVar112;
                    auVar29._28_4_ = fVar129;
                    auVar54 = vfmadd213ps_fma(auVar160,auVar102,auVar29);
                    auVar54 = vfmadd213ps_fma(auVar151,auVar101,ZEXT1632(auVar54));
                    auVar79 = ZEXT1632(CONCAT412(auVar54._12_4_ + auVar54._12_4_,
                                                 CONCAT48(auVar54._8_4_ + auVar54._8_4_,
                                                          CONCAT44(auVar54._4_4_ + auVar54._4_4_,
                                                                   auVar54._0_4_ + auVar54._0_4_))))
                    ;
                    auVar161._0_4_ = auVar83._0_4_ * fVar53;
                    auVar161._4_4_ = auVar83._4_4_ * fVar107;
                    auVar161._8_4_ = auVar83._8_4_ * fVar108;
                    auVar161._12_4_ = auVar83._12_4_ * fVar109;
                    auVar161._16_4_ = auVar83._16_4_ * fVar110;
                    auVar161._20_4_ = auVar83._20_4_ * fVar111;
                    auVar161._24_4_ = auVar83._24_4_ * fVar112;
                    auVar161._28_4_ = 0;
                    auVar54 = vfmadd213ps_fma(auVar82,auVar102,auVar161);
                    auVar74 = vfmadd213ps_fma(auVar103,auVar101,ZEXT1632(auVar54));
                    auVar103 = vrcp14ps_avx512vl(auVar79);
                    auVar98._8_4_ = 0x3f800000;
                    auVar98._0_8_ = 0x3f8000003f800000;
                    auVar98._12_4_ = 0x3f800000;
                    auVar98._16_4_ = 0x3f800000;
                    auVar98._20_4_ = 0x3f800000;
                    auVar98._24_4_ = 0x3f800000;
                    auVar98._28_4_ = 0x3f800000;
                    auVar100 = vfnmadd213ps_avx512vl(auVar103,auVar79,auVar98);
                    auVar54 = vfmadd132ps_fma(auVar100,auVar103,auVar103);
                    local_1360._28_4_ = auVar103._28_4_;
                    local_1360._0_28_ =
                         ZEXT1628(CONCAT412(auVar54._12_4_ * (auVar74._12_4_ + auVar74._12_4_),
                                            CONCAT48(auVar54._8_4_ * (auVar74._8_4_ + auVar74._8_4_)
                                                     ,CONCAT44(auVar54._4_4_ *
                                                               (auVar74._4_4_ + auVar74._4_4_),
                                                               auVar54._0_4_ *
                                                               (auVar74._0_4_ + auVar74._0_4_)))));
                    auVar143 = ZEXT3264(local_1360);
                    auVar116._4_4_ = fVar128;
                    auVar116._0_4_ = fVar128;
                    auVar116._8_4_ = fVar128;
                    auVar116._12_4_ = fVar128;
                    auVar116._16_4_ = fVar128;
                    auVar116._20_4_ = fVar128;
                    auVar116._24_4_ = fVar128;
                    auVar116._28_4_ = fVar128;
                    uVar22 = vcmpps_avx512vl(local_1360,auVar116,2);
                    uVar2 = *(undefined4 *)(local_13f0 + local_1488 * 4 + 0x60);
                    auVar28._4_4_ = uVar2;
                    auVar28._0_4_ = uVar2;
                    auVar28._8_4_ = uVar2;
                    auVar28._12_4_ = uVar2;
                    auVar28._16_4_ = uVar2;
                    auVar28._20_4_ = uVar2;
                    auVar28._24_4_ = uVar2;
                    auVar28._28_4_ = uVar2;
                    uVar24 = vcmpps_avx512vl(local_1360,auVar28,0xd);
                    bVar25 = (byte)uVar22 & (byte)uVar24 & bVar25;
                    if (bVar25 != 0) {
                      uVar45 = vcmpps_avx512vl(auVar79,_DAT_01faff00,4);
                      uVar45 = bVar25 & uVar45;
                      local_11f8 = (byte)uVar45;
                      if (local_11f8 != 0) {
                        local_1200 = &local_1491;
                        local_11a0 = local_1360;
                        auVar103 = vsubps_avx(local_1220,auVar96);
                        auVar103 = vblendps_avx(auVar97,auVar103,0xf0);
                        auVar100 = vsubps_avx(local_1220,auVar97);
                        local_1240 = vblendps_avx(auVar96,auVar100,0xf0);
                        local_1180[0] = auVar101._0_4_ * 1.0;
                        local_1180[1] = auVar101._4_4_ * 1.0;
                        local_1180[2] = auVar101._8_4_ * 1.0;
                        local_1180[3] = auVar101._12_4_ * 1.0;
                        fStack_1170 = auVar101._16_4_ * -1.0;
                        fStack_116c = auVar101._20_4_ * -1.0;
                        fStack_1168 = auVar101._24_4_ * -1.0;
                        uStack_1164 = auVar101._28_4_;
                        local_1160[0] = auVar102._0_4_ * 1.0;
                        local_1160[1] = auVar102._4_4_ * 1.0;
                        local_1160[2] = auVar102._8_4_ * 1.0;
                        local_1160[3] = auVar102._12_4_ * 1.0;
                        fStack_1150 = auVar102._16_4_ * -1.0;
                        fStack_114c = auVar102._20_4_ * -1.0;
                        fStack_1148 = auVar102._24_4_ * -1.0;
                        uStack_1144 = auVar102._28_4_;
                        local_1140._4_4_ = fVar107 * 1.0;
                        local_1140._0_4_ = fVar53 * 1.0;
                        local_1140._8_4_ = fVar108 * 1.0;
                        local_1140._12_4_ = fVar109 * 1.0;
                        local_1140._16_4_ = fVar110 * -1.0;
                        local_1140._20_4_ = fVar111 * -1.0;
                        local_1140._24_4_ = fVar112 * -1.0;
                        local_1140._28_4_ =
                             (uint)bVar15 * auVar87._28_4_ | (uint)!bVar15 * auVar90._28_4_;
                        auVar100 = vpbroadcastd_avx512vl();
                        auVar100 = vpaddd_avx2(auVar100,_DAT_01fec4a0);
                        auVar133._0_4_ = (float)(int)(*(ushort *)(local_13d8 + 8 + local_13e0) - 1);
                        auVar133._4_12_ = auVar83._4_12_;
                        auVar136._4_12_ = ZEXT812(0) << 0x20;
                        auVar136._0_4_ = auVar133._0_4_;
                        auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar136);
                        auVar54 = vfnmadd213ss_fma(auVar74,auVar133,ZEXT416(0x40000000));
                        fVar129 = auVar74._0_4_ * auVar54._0_4_;
                        auVar100 = vcvtdq2ps_avx(auVar100);
                        fVar111 = auVar100._28_4_ + auVar103._28_4_;
                        fVar53 = (local_1220._0_4_ * auVar100._0_4_ + auVar103._0_4_) * fVar129;
                        fVar107 = (local_1220._4_4_ * auVar100._4_4_ + auVar103._4_4_) * fVar129;
                        local_1260._4_4_ = fVar107;
                        local_1260._0_4_ = fVar53;
                        fVar128 = (local_1220._8_4_ * auVar100._8_4_ + auVar103._8_4_) * fVar129;
                        local_1260._8_4_ = fVar128;
                        fVar108 = (local_1220._12_4_ * auVar100._12_4_ + auVar103._12_4_) * fVar129;
                        local_1260._12_4_ = fVar108;
                        fVar109 = (local_1220._16_4_ * auVar100._16_4_ + auVar103._16_4_) * fVar129;
                        local_1260._16_4_ = fVar109;
                        fVar110 = (local_1220._20_4_ * auVar100._20_4_ + auVar103._20_4_) * fVar129;
                        local_1260._20_4_ = fVar110;
                        fVar129 = (local_1220._24_4_ * auVar100._24_4_ + auVar103._24_4_) * fVar129;
                        local_1260._24_4_ = fVar129;
                        local_1260._28_4_ = fVar111;
                        pGVar9 = (local_13d0->geometries).items[uVar39].ptr;
                        if ((pGVar9->mask & *(uint *)(local_13f0 + local_1488 * 4 + 0x120)) != 0) {
                          auVar103 = vpbroadcastd_avx512vl();
                          auVar103 = vpaddd_avx2(auVar103,_DAT_01fec4c0);
                          auVar103 = vcvtdq2ps_avx(auVar103);
                          auVar134._0_4_ =
                               (float)(int)(*(ushort *)(local_13d8 + 10 + local_13e0) - 1);
                          auVar134._4_12_ = auVar97._4_12_;
                          auVar32._12_4_ = 0;
                          auVar32._0_12_ = ZEXT812(0);
                          auVar74 = vrcp14ss_avx512f(auVar32 << 0x20,ZEXT416((uint)auVar134._0_4_));
                          auVar54 = vfnmadd213ss_fma(auVar74,auVar134,ZEXT416(0x40000000));
                          fVar169 = auVar74._0_4_ * auVar54._0_4_;
                          auVar97._8_4_ = 0x219392ef;
                          auVar97._0_8_ = 0x219392ef219392ef;
                          auVar97._12_4_ = 0x219392ef;
                          auVar97._16_4_ = 0x219392ef;
                          auVar97._20_4_ = 0x219392ef;
                          auVar97._24_4_ = 0x219392ef;
                          auVar97._28_4_ = 0x219392ef;
                          uVar41 = vcmpps_avx512vl(local_1220,auVar97,5);
                          auVar100 = vrcp14ps_avx512vl(local_1220);
                          auVar137._8_4_ = 0x3f800000;
                          auVar137._0_8_ = 0x3f8000003f800000;
                          auVar137._12_4_ = 0x3f800000;
                          auVar137._16_4_ = 0x3f800000;
                          auVar137._20_4_ = 0x3f800000;
                          auVar137._24_4_ = 0x3f800000;
                          auVar137._28_4_ = 0x3f800000;
                          auVar54 = vfnmadd213ps_fma(local_1220,auVar100,auVar137);
                          auVar100 = vfmadd132ps_avx512vl(ZEXT1632(auVar54),auVar100,auVar100);
                          fVar157 = (float)((uint)((byte)uVar41 & 1) * auVar100._0_4_);
                          fVar112 = (float)((uint)((byte)(uVar41 >> 1) & 1) * auVar100._4_4_);
                          fVar158 = (float)((uint)((byte)(uVar41 >> 2) & 1) * auVar100._8_4_);
                          fVar164 = (float)((uint)((byte)(uVar41 >> 3) & 1) * auVar100._12_4_);
                          fVar165 = (float)((uint)((byte)(uVar41 >> 4) & 1) * auVar100._16_4_);
                          fVar166 = (float)((uint)((byte)(uVar41 >> 5) & 1) * auVar100._20_4_);
                          fVar168 = (float)((uint)((byte)(uVar41 >> 6) & 1) * auVar100._24_4_);
                          auVar30._4_4_ = fVar107 * fVar112;
                          auVar30._0_4_ = fVar53 * fVar157;
                          auVar30._8_4_ = fVar128 * fVar158;
                          auVar30._12_4_ = fVar108 * fVar164;
                          auVar30._16_4_ = fVar109 * fVar165;
                          auVar30._20_4_ = fVar110 * fVar166;
                          auVar30._24_4_ = fVar129 * fVar168;
                          auVar30._28_4_ = fVar111;
                          local_11e0 = vminps_avx(auVar30,auVar137);
                          auVar31._4_4_ =
                               (local_1220._4_4_ * auVar103._4_4_ + local_1240._4_4_) * fVar169 *
                               fVar112;
                          auVar31._0_4_ =
                               (local_1220._0_4_ * auVar103._0_4_ + local_1240._0_4_) * fVar169 *
                               fVar157;
                          auVar31._8_4_ =
                               (local_1220._8_4_ * auVar103._8_4_ + local_1240._8_4_) * fVar169 *
                               fVar158;
                          auVar31._12_4_ =
                               (local_1220._12_4_ * auVar103._12_4_ + local_1240._12_4_) * fVar169 *
                               fVar164;
                          auVar31._16_4_ =
                               (local_1220._16_4_ * auVar103._16_4_ + local_1240._16_4_) * fVar169 *
                               fVar165;
                          auVar31._20_4_ =
                               (local_1220._20_4_ * auVar103._20_4_ + local_1240._20_4_) * fVar169 *
                               fVar166;
                          auVar31._24_4_ =
                               (local_1220._24_4_ * auVar103._24_4_ + local_1240._24_4_) * fVar169 *
                               fVar168;
                          auVar31._28_4_ = auVar103._28_4_ + local_1240._28_4_;
                          local_11c0 = vminps_avx(auVar31,auVar137);
                          auVar117._8_4_ = 0x7f800000;
                          auVar117._0_8_ = 0x7f8000007f800000;
                          auVar117._12_4_ = 0x7f800000;
                          auVar117._16_4_ = 0x7f800000;
                          auVar117._20_4_ = 0x7f800000;
                          auVar117._24_4_ = 0x7f800000;
                          auVar117._28_4_ = 0x7f800000;
                          auVar103 = vblendmps_avx512vl(auVar117,local_1360);
                          auVar104._0_4_ =
                               (uint)(local_11f8 & 1) * auVar103._0_4_ |
                               (uint)!(bool)(local_11f8 & 1) * 0x7f800000;
                          bVar15 = (bool)((byte)(uVar45 >> 1) & 1);
                          auVar104._4_4_ =
                               (uint)bVar15 * auVar103._4_4_ | (uint)!bVar15 * 0x7f800000;
                          bVar15 = (bool)((byte)(uVar45 >> 2) & 1);
                          auVar104._8_4_ =
                               (uint)bVar15 * auVar103._8_4_ | (uint)!bVar15 * 0x7f800000;
                          bVar15 = (bool)((byte)(uVar45 >> 3) & 1);
                          auVar104._12_4_ =
                               (uint)bVar15 * auVar103._12_4_ | (uint)!bVar15 * 0x7f800000;
                          bVar15 = (bool)((byte)(uVar45 >> 4) & 1);
                          auVar104._16_4_ =
                               (uint)bVar15 * auVar103._16_4_ | (uint)!bVar15 * 0x7f800000;
                          bVar15 = (bool)((byte)(uVar45 >> 5) & 1);
                          auVar104._20_4_ =
                               (uint)bVar15 * auVar103._20_4_ | (uint)!bVar15 * 0x7f800000;
                          bVar15 = (bool)((byte)(uVar45 >> 6) & 1);
                          auVar104._24_4_ =
                               (uint)bVar15 * auVar103._24_4_ | (uint)!bVar15 * 0x7f800000;
                          bVar15 = SUB81(uVar45 >> 7,0);
                          auVar104._28_4_ =
                               (uint)bVar15 * auVar103._28_4_ | (uint)!bVar15 * 0x7f800000;
                          auVar103 = vshufps_avx(auVar104,auVar104,0xb1);
                          auVar103 = vminps_avx(auVar104,auVar103);
                          auVar100 = vshufpd_avx(auVar103,auVar103,5);
                          auVar103 = vminps_avx(auVar103,auVar100);
                          auVar100 = vpermpd_avx2(auVar103,0x4e);
                          auVar103 = vminps_avx(auVar103,auVar100);
                          uVar22 = vcmpps_avx512vl(auVar104,auVar103,0);
                          uVar36 = (uint)uVar45;
                          if ((local_11f8 & (byte)uVar22) != 0) {
                            uVar36 = (uint)(local_11f8 & (byte)uVar22);
                          }
                          uVar26 = 0;
                          for (; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x80000000) {
                            uVar26 = uVar26 + 1;
                          }
                          uVar41 = (ulong)uVar26;
                          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                             (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_1320 = vpbroadcastd_avx512vl();
                            local_1340 = vpbroadcastd_avx512vl();
                            local_1450 = ZEXT416(*(uint *)(local_13f0 + local_1488 * 4 + 0x100));
                            do {
                              uVar2 = *(undefined4 *)(local_11e0 + uVar41 * 4);
                              local_1060._4_4_ = uVar2;
                              local_1060._0_4_ = uVar2;
                              local_1060._8_4_ = uVar2;
                              local_1060._12_4_ = uVar2;
                              local_1060._16_4_ = uVar2;
                              local_1060._20_4_ = uVar2;
                              local_1060._24_4_ = uVar2;
                              local_1060._28_4_ = uVar2;
                              uVar2 = *(undefined4 *)(local_11c0 + uVar41 * 4);
                              local_1040._4_4_ = uVar2;
                              local_1040._0_4_ = uVar2;
                              local_1040._8_4_ = uVar2;
                              local_1040._12_4_ = uVar2;
                              local_1040._16_4_ = uVar2;
                              local_1040._20_4_ = uVar2;
                              local_1040._24_4_ = uVar2;
                              local_1040._28_4_ = uVar2;
                              *(float *)(pRVar33 + k * 4 + 0x100) = local_1180[uVar41 - 8];
                              local_13c0.context = context->user;
                              local_10c0 = local_1180[uVar41];
                              fVar129 = local_1160[uVar41];
                              local_10a0._4_4_ = fVar129;
                              local_10a0._0_4_ = fVar129;
                              local_10a0._8_4_ = fVar129;
                              local_10a0._12_4_ = fVar129;
                              local_10a0._16_4_ = fVar129;
                              local_10a0._20_4_ = fVar129;
                              local_10a0._24_4_ = fVar129;
                              local_10a0._28_4_ = fVar129;
                              uVar2 = *(undefined4 *)(local_1140 + uVar41 * 4);
                              local_1080._4_4_ = uVar2;
                              local_1080._0_4_ = uVar2;
                              local_1080._8_4_ = uVar2;
                              local_1080._12_4_ = uVar2;
                              local_1080._16_4_ = uVar2;
                              local_1080._20_4_ = uVar2;
                              local_1080._24_4_ = uVar2;
                              local_1080._28_4_ = uVar2;
                              fStack_10bc = local_10c0;
                              fStack_10b8 = local_10c0;
                              fStack_10b4 = local_10c0;
                              fStack_10b0 = local_10c0;
                              fStack_10ac = local_10c0;
                              fStack_10a8 = local_10c0;
                              fStack_10a4 = local_10c0;
                              local_1020 = local_1340._0_8_;
                              uStack_1018 = local_1340._8_8_;
                              uStack_1010 = local_1340._16_8_;
                              uStack_1008 = local_1340._24_8_;
                              local_1000 = local_1320;
                              vpcmpeqd_avx2(local_1320,local_1320);
                              uStack_fdc = (local_13c0.context)->instID[0];
                              local_fe0 = uStack_fdc;
                              uStack_fd8 = uStack_fdc;
                              uStack_fd4 = uStack_fdc;
                              uStack_fd0 = uStack_fdc;
                              uStack_fcc = uStack_fdc;
                              uStack_fc8 = uStack_fdc;
                              uStack_fc4 = uStack_fdc;
                              uStack_fbc = (local_13c0.context)->instPrimID[0];
                              local_fc0 = uStack_fbc;
                              uStack_fb8 = uStack_fbc;
                              uStack_fb4 = uStack_fbc;
                              uStack_fb0 = uStack_fbc;
                              uStack_fac = uStack_fbc;
                              uStack_fa8 = uStack_fbc;
                              uStack_fa4 = uStack_fbc;
                              local_1300 = local_1120;
                              local_13c0.valid = (int *)local_1300;
                              local_13c0.geometryUserPtr = pGVar9->userPtr;
                              local_13c0.ray = (RTCRayN *)pRVar33;
                              local_13c0.hit = (RTCHitN *)&local_10c0;
                              local_13c0.N = 8;
                              if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar9->intersectionFilterN)(&local_13c0);
                                auVar143 = ZEXT3264(local_1360);
                                k = local_1488;
                              }
                              if (local_1300 == (undefined1  [32])0x0) {
LAB_0075ea5e:
                                *(undefined4 *)(pRVar33 + k * 4 + 0x100) = local_1450._0_4_;
                              }
                              else {
                                p_Var14 = context->args->filter;
                                if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var14)(&local_13c0);
                                  auVar143 = ZEXT3264(local_1360);
                                  k = local_1488;
                                }
                                if (local_1300 == (undefined1  [32])0x0) goto LAB_0075ea5e;
                                uVar46 = vptestmd_avx512vl(local_1300,local_1300);
                                fVar129 = *(float *)(local_13c0.hit + 4);
                                fVar53 = *(float *)(local_13c0.hit + 8);
                                fVar107 = *(float *)(local_13c0.hit + 0xc);
                                fVar128 = *(float *)(local_13c0.hit + 0x10);
                                fVar108 = *(float *)(local_13c0.hit + 0x14);
                                fVar109 = *(float *)(local_13c0.hit + 0x18);
                                fVar110 = *(float *)(local_13c0.hit + 0x1c);
                                bVar25 = (byte)uVar46;
                                bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
                                bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
                                bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                bVar18 = (bool)((byte)(uVar46 >> 4) & 1);
                                bVar19 = (bool)((byte)(uVar46 >> 5) & 1);
                                bVar20 = (bool)((byte)(uVar46 >> 6) & 1);
                                bVar21 = SUB81(uVar46 >> 7,0);
                                *(uint *)(local_13c0.ray + 0x180) =
                                     (uint)(bVar25 & 1) * (int)*(float *)local_13c0.hit |
                                     (uint)!(bool)(bVar25 & 1) * *(int *)(local_13c0.ray + 0x180);
                                *(uint *)(local_13c0.ray + 0x184) =
                                     (uint)bVar15 * (int)fVar129 |
                                     (uint)!bVar15 * *(int *)(local_13c0.ray + 0x184);
                                *(uint *)(local_13c0.ray + 0x188) =
                                     (uint)bVar16 * (int)fVar53 |
                                     (uint)!bVar16 * *(int *)(local_13c0.ray + 0x188);
                                *(uint *)(local_13c0.ray + 0x18c) =
                                     (uint)bVar17 * (int)fVar107 |
                                     (uint)!bVar17 * *(int *)(local_13c0.ray + 0x18c);
                                *(uint *)(local_13c0.ray + 400) =
                                     (uint)bVar18 * (int)fVar128 |
                                     (uint)!bVar18 * *(int *)(local_13c0.ray + 400);
                                *(uint *)(local_13c0.ray + 0x194) =
                                     (uint)bVar19 * (int)fVar108 |
                                     (uint)!bVar19 * *(int *)(local_13c0.ray + 0x194);
                                *(uint *)(local_13c0.ray + 0x198) =
                                     (uint)bVar20 * (int)fVar109 |
                                     (uint)!bVar20 * *(int *)(local_13c0.ray + 0x198);
                                *(uint *)(local_13c0.ray + 0x19c) =
                                     (uint)bVar21 * (int)fVar110 |
                                     (uint)!bVar21 * *(int *)(local_13c0.ray + 0x19c);
                                fVar129 = *(float *)(local_13c0.hit + 0x24);
                                fVar53 = *(float *)(local_13c0.hit + 0x28);
                                fVar107 = *(float *)(local_13c0.hit + 0x2c);
                                fVar128 = *(float *)(local_13c0.hit + 0x30);
                                fVar108 = *(float *)(local_13c0.hit + 0x34);
                                fVar109 = *(float *)(local_13c0.hit + 0x38);
                                fVar110 = *(float *)(local_13c0.hit + 0x3c);
                                bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
                                bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
                                bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                bVar18 = (bool)((byte)(uVar46 >> 4) & 1);
                                bVar19 = (bool)((byte)(uVar46 >> 5) & 1);
                                bVar20 = (bool)((byte)(uVar46 >> 6) & 1);
                                bVar21 = SUB81(uVar46 >> 7,0);
                                *(uint *)(local_13c0.ray + 0x1a0) =
                                     (uint)(bVar25 & 1) * (int)*(float *)(local_13c0.hit + 0x20) |
                                     (uint)!(bool)(bVar25 & 1) * *(int *)(local_13c0.ray + 0x1a0);
                                *(uint *)(local_13c0.ray + 0x1a4) =
                                     (uint)bVar15 * (int)fVar129 |
                                     (uint)!bVar15 * *(int *)(local_13c0.ray + 0x1a4);
                                *(uint *)(local_13c0.ray + 0x1a8) =
                                     (uint)bVar16 * (int)fVar53 |
                                     (uint)!bVar16 * *(int *)(local_13c0.ray + 0x1a8);
                                *(uint *)(local_13c0.ray + 0x1ac) =
                                     (uint)bVar17 * (int)fVar107 |
                                     (uint)!bVar17 * *(int *)(local_13c0.ray + 0x1ac);
                                *(uint *)(local_13c0.ray + 0x1b0) =
                                     (uint)bVar18 * (int)fVar128 |
                                     (uint)!bVar18 * *(int *)(local_13c0.ray + 0x1b0);
                                *(uint *)(local_13c0.ray + 0x1b4) =
                                     (uint)bVar19 * (int)fVar108 |
                                     (uint)!bVar19 * *(int *)(local_13c0.ray + 0x1b4);
                                *(uint *)(local_13c0.ray + 0x1b8) =
                                     (uint)bVar20 * (int)fVar109 |
                                     (uint)!bVar20 * *(int *)(local_13c0.ray + 0x1b8);
                                *(uint *)(local_13c0.ray + 0x1bc) =
                                     (uint)bVar21 * (int)fVar110 |
                                     (uint)!bVar21 * *(int *)(local_13c0.ray + 0x1bc);
                                fVar129 = *(float *)(local_13c0.hit + 0x44);
                                fVar53 = *(float *)(local_13c0.hit + 0x48);
                                fVar107 = *(float *)(local_13c0.hit + 0x4c);
                                fVar128 = *(float *)(local_13c0.hit + 0x50);
                                fVar108 = *(float *)(local_13c0.hit + 0x54);
                                fVar109 = *(float *)(local_13c0.hit + 0x58);
                                fVar110 = *(float *)(local_13c0.hit + 0x5c);
                                bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
                                bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
                                bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                bVar18 = (bool)((byte)(uVar46 >> 4) & 1);
                                bVar19 = (bool)((byte)(uVar46 >> 5) & 1);
                                bVar20 = (bool)((byte)(uVar46 >> 6) & 1);
                                bVar21 = SUB81(uVar46 >> 7,0);
                                *(uint *)(local_13c0.ray + 0x1c0) =
                                     (uint)(bVar25 & 1) * (int)*(float *)(local_13c0.hit + 0x40) |
                                     (uint)!(bool)(bVar25 & 1) * *(int *)(local_13c0.ray + 0x1c0);
                                *(uint *)(local_13c0.ray + 0x1c4) =
                                     (uint)bVar15 * (int)fVar129 |
                                     (uint)!bVar15 * *(int *)(local_13c0.ray + 0x1c4);
                                *(uint *)(local_13c0.ray + 0x1c8) =
                                     (uint)bVar16 * (int)fVar53 |
                                     (uint)!bVar16 * *(int *)(local_13c0.ray + 0x1c8);
                                *(uint *)(local_13c0.ray + 0x1cc) =
                                     (uint)bVar17 * (int)fVar107 |
                                     (uint)!bVar17 * *(int *)(local_13c0.ray + 0x1cc);
                                *(uint *)(local_13c0.ray + 0x1d0) =
                                     (uint)bVar18 * (int)fVar128 |
                                     (uint)!bVar18 * *(int *)(local_13c0.ray + 0x1d0);
                                *(uint *)(local_13c0.ray + 0x1d4) =
                                     (uint)bVar19 * (int)fVar108 |
                                     (uint)!bVar19 * *(int *)(local_13c0.ray + 0x1d4);
                                *(uint *)(local_13c0.ray + 0x1d8) =
                                     (uint)bVar20 * (int)fVar109 |
                                     (uint)!bVar20 * *(int *)(local_13c0.ray + 0x1d8);
                                *(uint *)(local_13c0.ray + 0x1dc) =
                                     (uint)bVar21 * (int)fVar110 |
                                     (uint)!bVar21 * *(int *)(local_13c0.ray + 0x1dc);
                                fVar129 = *(float *)(local_13c0.hit + 100);
                                fVar53 = *(float *)(local_13c0.hit + 0x68);
                                fVar107 = *(float *)(local_13c0.hit + 0x6c);
                                fVar128 = *(float *)(local_13c0.hit + 0x70);
                                fVar108 = *(float *)(local_13c0.hit + 0x74);
                                fVar109 = *(float *)(local_13c0.hit + 0x78);
                                fVar110 = *(float *)(local_13c0.hit + 0x7c);
                                bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
                                bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
                                bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                bVar18 = (bool)((byte)(uVar46 >> 4) & 1);
                                bVar19 = (bool)((byte)(uVar46 >> 5) & 1);
                                bVar20 = (bool)((byte)(uVar46 >> 6) & 1);
                                bVar21 = SUB81(uVar46 >> 7,0);
                                *(uint *)(local_13c0.ray + 0x1e0) =
                                     (uint)(bVar25 & 1) * (int)*(float *)(local_13c0.hit + 0x60) |
                                     (uint)!(bool)(bVar25 & 1) * *(int *)(local_13c0.ray + 0x1e0);
                                *(uint *)(local_13c0.ray + 0x1e4) =
                                     (uint)bVar15 * (int)fVar129 |
                                     (uint)!bVar15 * *(int *)(local_13c0.ray + 0x1e4);
                                *(uint *)(local_13c0.ray + 0x1e8) =
                                     (uint)bVar16 * (int)fVar53 |
                                     (uint)!bVar16 * *(int *)(local_13c0.ray + 0x1e8);
                                *(uint *)(local_13c0.ray + 0x1ec) =
                                     (uint)bVar17 * (int)fVar107 |
                                     (uint)!bVar17 * *(int *)(local_13c0.ray + 0x1ec);
                                *(uint *)(local_13c0.ray + 0x1f0) =
                                     (uint)bVar18 * (int)fVar128 |
                                     (uint)!bVar18 * *(int *)(local_13c0.ray + 0x1f0);
                                *(uint *)(local_13c0.ray + 500) =
                                     (uint)bVar19 * (int)fVar108 |
                                     (uint)!bVar19 * *(int *)(local_13c0.ray + 500);
                                *(uint *)(local_13c0.ray + 0x1f8) =
                                     (uint)bVar20 * (int)fVar109 |
                                     (uint)!bVar20 * *(int *)(local_13c0.ray + 0x1f8);
                                *(uint *)(local_13c0.ray + 0x1fc) =
                                     (uint)bVar21 * (int)fVar110 |
                                     (uint)!bVar21 * *(int *)(local_13c0.ray + 0x1fc);
                                auVar103 = *(undefined1 (*) [32])(local_13c0.ray + 0x200);
                                auVar105._0_4_ =
                                     (uint)(bVar25 & 1) * (int)*(float *)(local_13c0.hit + 0x80) |
                                     (uint)!(bool)(bVar25 & 1) * auVar103._0_4_;
                                bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
                                auVar105._4_4_ =
                                     (uint)bVar15 * (int)*(float *)(local_13c0.hit + 0x84) |
                                     (uint)!bVar15 * auVar103._4_4_;
                                bVar15 = (bool)((byte)(uVar46 >> 2) & 1);
                                auVar105._8_4_ =
                                     (uint)bVar15 * (int)*(float *)(local_13c0.hit + 0x88) |
                                     (uint)!bVar15 * auVar103._8_4_;
                                bVar15 = (bool)((byte)(uVar46 >> 3) & 1);
                                auVar105._12_4_ =
                                     (uint)bVar15 * (int)*(float *)(local_13c0.hit + 0x8c) |
                                     (uint)!bVar15 * auVar103._12_4_;
                                bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
                                auVar105._16_4_ =
                                     (uint)bVar15 * (int)*(float *)(local_13c0.hit + 0x90) |
                                     (uint)!bVar15 * auVar103._16_4_;
                                bVar15 = (bool)((byte)(uVar46 >> 5) & 1);
                                auVar105._20_4_ =
                                     (uint)bVar15 * (int)*(float *)(local_13c0.hit + 0x94) |
                                     (uint)!bVar15 * auVar103._20_4_;
                                bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                                auVar105._24_4_ =
                                     (uint)bVar15 * (int)*(float *)(local_13c0.hit + 0x98) |
                                     (uint)!bVar15 * auVar103._24_4_;
                                bVar15 = SUB81(uVar46 >> 7,0);
                                auVar105._28_4_ =
                                     (uint)bVar15 * (int)*(float *)(local_13c0.hit + 0x9c) |
                                     (uint)!bVar15 * auVar103._28_4_;
                                *(undefined1 (*) [32])(local_13c0.ray + 0x200) = auVar105;
                                auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                               (local_13c0.hit + 0xa0));
                                *(undefined1 (*) [32])(local_13c0.ray + 0x220) = auVar103;
                                auVar103 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                               (local_13c0.hit + 0xc0));
                                *(undefined1 (*) [32])(local_13c0.ray + 0x240) = auVar103;
                                auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                               (local_13c0.hit + 0xe0));
                                *(undefined1 (*) [32])(local_13c0.ray + 0x260) = auVar103;
                                auVar103 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                               (local_13c0.hit + 0x100));
                                *(undefined1 (*) [32])(local_13c0.ray + 0x280) = auVar103;
                                local_1450._0_4_ = *(undefined4 *)(pRVar33 + k * 4 + 0x100);
                                local_1450._4_4_ = 0;
                                local_1450._8_4_ = 0;
                                local_1450._12_4_ = 0;
                              }
                              bVar25 = ~(byte)(1 << ((uint)uVar41 & 0x1f)) & (byte)uVar45;
                              auVar118._4_4_ = local_1450._0_4_;
                              auVar118._0_4_ = local_1450._0_4_;
                              auVar118._8_4_ = local_1450._0_4_;
                              auVar118._12_4_ = local_1450._0_4_;
                              auVar118._16_4_ = local_1450._0_4_;
                              auVar118._20_4_ = local_1450._0_4_;
                              auVar118._24_4_ = local_1450._0_4_;
                              auVar118._28_4_ = local_1450._0_4_;
                              uVar22 = vcmpps_avx512vl(auVar143._0_32_,auVar118,2);
                              if ((bVar25 & (byte)uVar22) == 0) goto LAB_0075e756;
                              bVar25 = bVar25 & (byte)uVar22;
                              uVar45 = (ulong)bVar25;
                              auVar119._8_4_ = 0x7f800000;
                              auVar119._0_8_ = 0x7f8000007f800000;
                              auVar119._12_4_ = 0x7f800000;
                              auVar119._16_4_ = 0x7f800000;
                              auVar119._20_4_ = 0x7f800000;
                              auVar119._24_4_ = 0x7f800000;
                              auVar119._28_4_ = 0x7f800000;
                              auVar103 = vblendmps_avx512vl(auVar119,auVar143._0_32_);
                              auVar106._0_4_ =
                                   (uint)(bVar25 & 1) * auVar103._0_4_ |
                                   (uint)!(bool)(bVar25 & 1) * 0x7f800000;
                              bVar15 = (bool)(bVar25 >> 1 & 1);
                              auVar106._4_4_ =
                                   (uint)bVar15 * auVar103._4_4_ | (uint)!bVar15 * 0x7f800000;
                              bVar15 = (bool)(bVar25 >> 2 & 1);
                              auVar106._8_4_ =
                                   (uint)bVar15 * auVar103._8_4_ | (uint)!bVar15 * 0x7f800000;
                              bVar15 = (bool)(bVar25 >> 3 & 1);
                              auVar106._12_4_ =
                                   (uint)bVar15 * auVar103._12_4_ | (uint)!bVar15 * 0x7f800000;
                              bVar15 = (bool)(bVar25 >> 4 & 1);
                              auVar106._16_4_ =
                                   (uint)bVar15 * auVar103._16_4_ | (uint)!bVar15 * 0x7f800000;
                              bVar15 = (bool)(bVar25 >> 5 & 1);
                              auVar106._20_4_ =
                                   (uint)bVar15 * auVar103._20_4_ | (uint)!bVar15 * 0x7f800000;
                              bVar15 = (bool)(bVar25 >> 6 & 1);
                              auVar106._24_4_ =
                                   (uint)bVar15 * auVar103._24_4_ | (uint)!bVar15 * 0x7f800000;
                              auVar106._28_4_ =
                                   (uint)(bVar25 >> 7) * auVar103._28_4_ |
                                   (uint)!(bool)(bVar25 >> 7) * 0x7f800000;
                              auVar103 = vshufps_avx(auVar106,auVar106,0xb1);
                              auVar103 = vminps_avx(auVar106,auVar103);
                              auVar100 = vshufpd_avx(auVar103,auVar103,5);
                              auVar103 = vminps_avx(auVar103,auVar100);
                              auVar100 = vpermpd_avx2(auVar103,0x4e);
                              auVar103 = vminps_avx(auVar103,auVar100);
                              uVar22 = vcmpps_avx512vl(auVar106,auVar103,0);
                              bVar34 = (byte)uVar22 & bVar25;
                              if (bVar34 != 0) {
                                bVar25 = bVar34;
                              }
                              uVar39 = 0;
                              for (uVar37 = (uint)bVar25; (uVar37 & 1) == 0;
                                  uVar37 = uVar37 >> 1 | 0x80000000) {
                                uVar39 = uVar39 + 1;
                              }
                              uVar41 = (ulong)uVar39;
                            } while( true );
                          }
                          uVar2 = *(undefined4 *)(local_11e0 + uVar41 * 4);
                          uVar4 = *(undefined4 *)(local_11c0 + uVar41 * 4);
                          fVar129 = local_1180[uVar41];
                          fVar53 = local_1160[uVar41];
                          uVar5 = *(undefined4 *)(local_1140 + uVar41 * 4);
                          *(float *)(local_13f0 + local_1488 * 4 + 0x100) = local_1180[uVar41 - 8];
                          *(float *)(local_13f0 + local_1488 * 4 + 0x180) = fVar129;
                          *(float *)(local_13f0 + local_1488 * 4 + 0x1a0) = fVar53;
                          *(undefined4 *)(local_13f0 + local_1488 * 4 + 0x1c0) = uVar5;
                          *(undefined4 *)(local_13f0 + local_1488 * 4 + 0x1e0) = uVar2;
                          *(undefined4 *)(local_13f0 + local_1488 * 4 + 0x200) = uVar4;
                          *(uint *)(local_13f0 + local_1488 * 4 + 0x220) = uVar37;
                          *(uint *)(local_13f0 + local_1488 * 4 + 0x240) = uVar39;
                          *(uint *)(local_13f0 + local_1488 * 4 + 0x260) = context->user->instID[0];
                          *(uint *)(local_13f0 + local_1488 * 4 + 0x280) =
                               context->user->instPrimID[0];
                        }
                      }
                    }
                  }
LAB_0075e756:
                  auVar162 = ZEXT1664(local_1290);
                  auVar174 = ZEXT1664(local_12d0);
                  auVar175 = ZEXT1664(local_1280);
                  puVar35 = local_13e8;
                  uVar41 = local_1408;
                  uVar45 = local_1490;
                  uVar46 = local_13f8;
                  uVar48 = local_1400;
                  ray = pRVar33;
                  uVar50 = local_1410;
                  uVar51 = local_1418;
                  fVar129 = local_12a0;
                  fVar164 = fStack_129c;
                  fVar165 = fStack_1298;
                  fVar166 = fStack_1294;
                  fVar53 = local_12b0;
                  fVar168 = fStack_12ac;
                  fVar169 = fStack_12a8;
                  fVar170 = fStack_12a4;
                  fVar107 = local_12c0;
                  fVar171 = fStack_12bc;
                  fVar172 = fStack_12b8;
                  fVar173 = fStack_12b4;
                }
                local_13c8 = local_13c8 - 1 & local_13c8;
              } while (local_13c8 != 0);
            }
            local_1420 = local_1420 + 1;
          } while (local_1420 != local_1428);
        }
        auVar54 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
        auVar175 = ZEXT1664(auVar54);
        auVar147 = ZEXT1664(local_1440);
        auVar143 = ZEXT1664(local_1460);
        auVar152 = ZEXT1664(_local_1390);
        fVar128 = local_1370;
        fVar109 = fStack_136c;
        fVar110 = fStack_1368;
        fVar111 = fStack_1364;
        fVar108 = local_1380;
        fVar112 = fStack_137c;
        fVar157 = fStack_1378;
        fVar158 = fStack_1374;
        break;
      }
      uVar38 = uVar49 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar113._4_4_ = uVar2;
      auVar113._0_4_ = uVar2;
      auVar113._8_4_ = uVar2;
      auVar113._12_4_ = uVar2;
      auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar46),auVar113,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + uVar46));
      auVar54 = vsubps_avx(auVar54,auVar147._0_16_);
      auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar48),auVar113,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + uVar48));
      auVar120._0_4_ = fVar128 * auVar54._0_4_;
      auVar120._4_4_ = fVar109 * auVar54._4_4_;
      auVar120._8_4_ = fVar110 * auVar54._8_4_;
      auVar120._12_4_ = fVar111 * auVar54._12_4_;
      auVar54 = vsubps_avx(auVar74,auVar143._0_16_);
      auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar41),auVar113,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + uVar41));
      auVar123._0_4_ = fVar108 * auVar54._0_4_;
      auVar123._4_4_ = fVar112 * auVar54._4_4_;
      auVar123._8_4_ = fVar157 * auVar54._8_4_;
      auVar123._12_4_ = fVar158 * auVar54._12_4_;
      auVar54 = vsubps_avx(auVar74,auVar162._0_16_);
      auVar130._0_4_ = auVar152._0_4_ * auVar54._0_4_;
      auVar130._4_4_ = auVar152._4_4_ * auVar54._4_4_;
      auVar130._8_4_ = auVar152._8_4_ * auVar54._8_4_;
      auVar130._12_4_ = auVar152._12_4_ * auVar54._12_4_;
      auVar54 = vmaxps_avx(auVar123,auVar130);
      auVar74 = vmaxps_avx(auVar174._0_16_,auVar120);
      auVar54 = vmaxps_avx(auVar74,auVar54);
      auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar50),auVar113,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + uVar50));
      auVar74 = vsubps_avx(auVar74,auVar147._0_16_);
      auVar124._0_4_ = fVar129 * auVar74._0_4_;
      auVar124._4_4_ = fVar164 * auVar74._4_4_;
      auVar124._8_4_ = fVar165 * auVar74._8_4_;
      auVar124._12_4_ = fVar166 * auVar74._12_4_;
      auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar51),auVar113,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + uVar51));
      auVar74 = vsubps_avx(auVar74,auVar143._0_16_);
      auVar131._0_4_ = fVar53 * auVar74._0_4_;
      auVar131._4_4_ = fVar168 * auVar74._4_4_;
      auVar131._8_4_ = fVar169 * auVar74._8_4_;
      auVar131._12_4_ = fVar170 * auVar74._12_4_;
      auVar74 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar38 + 0x80 + uVar45),auVar113,
                                *(undefined1 (*) [16])(uVar38 + 0x20 + uVar45));
      auVar74 = vsubps_avx(auVar74,auVar162._0_16_);
      auVar135._0_4_ = fVar107 * auVar74._0_4_;
      auVar135._4_4_ = fVar171 * auVar74._4_4_;
      auVar135._8_4_ = fVar172 * auVar74._8_4_;
      auVar135._12_4_ = fVar173 * auVar74._12_4_;
      auVar74 = vminps_avx(auVar131,auVar135);
      auVar55 = vminps_avx512vl(local_1280,auVar124);
      auVar74 = vminps_avx(auVar55,auVar74);
      uVar22 = vcmpps_avx512vl(auVar54,auVar74,2);
      uVar39 = (uint)uVar22;
      if (((uint)uVar49 & 7) == 6) {
        uVar24 = vcmpps_avx512vl(auVar113,*(undefined1 (*) [16])(uVar38 + 0xf0),1);
        uVar23 = vcmpps_avx512vl(auVar113,*(undefined1 (*) [16])(uVar38 + 0xe0),0xd);
        uVar39 = (uint)(byte)((byte)uVar24 & (byte)uVar23 & (byte)uVar22);
      }
      local_1260._0_16_ = auVar54;
      if ((byte)uVar39 != 0) goto code_r0x0075d913;
      if (puVar35 == &local_fa0) {
        return;
      }
    }
    if (puVar35 == &local_fa0) {
      return;
    }
  } while( true );
code_r0x0075d913:
  lVar27 = 0;
  for (uVar49 = (ulong)(byte)uVar39; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
    lVar27 = lVar27 + 1;
  }
  uVar49 = *(ulong *)(uVar38 + lVar27 * 8);
  uVar39 = (uVar39 & 0xff) - 1 & uVar39 & 0xff;
  uVar40 = (ulong)uVar39;
  if (uVar39 != 0) {
    uVar37 = *(uint *)(local_1260 + lVar27 * 4);
    lVar27 = 0;
    for (; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
      lVar27 = lVar27 + 1;
    }
    uVar39 = uVar39 - 1 & uVar39;
    uVar44 = (ulong)uVar39;
    uVar40 = *(ulong *)(uVar38 + lVar27 * 8);
    uVar36 = *(uint *)(local_1260 + lVar27 * 4);
    uVar45 = local_1490;
    if (uVar39 == 0) {
      if (uVar37 < uVar36) {
        *puVar35 = uVar40;
        *(uint *)(puVar35 + 1) = uVar36;
        puVar35 = puVar35 + 2;
      }
      else {
        *puVar35 = uVar49;
        *(uint *)(puVar35 + 1) = uVar37;
        puVar35 = puVar35 + 2;
        uVar49 = uVar40;
      }
    }
    else {
      auVar114._8_8_ = 0;
      auVar114._0_8_ = uVar49;
      auVar54 = vpunpcklqdq_avx(auVar114,ZEXT416(uVar37));
      auVar121._8_8_ = 0;
      auVar121._0_8_ = uVar40;
      auVar74 = vpunpcklqdq_avx(auVar121,ZEXT416(uVar36));
      lVar27 = 0;
      for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar39 = uVar39 - 1 & uVar39;
      uVar49 = (ulong)uVar39;
      auVar122._8_8_ = 0;
      auVar122._0_8_ = *(ulong *)(uVar38 + lVar27 * 8);
      auVar127 = vpunpcklqdq_avx(auVar122,ZEXT416(*(uint *)(local_1260 + lVar27 * 4)));
      auVar55 = vpshufd_avx(auVar54,0xaa);
      auVar56 = vpshufd_avx(auVar74,0xaa);
      auVar126 = vpshufd_avx(auVar127,0xaa);
      if (uVar39 == 0) {
        uVar49 = vpcmpgtd_avx512vl(auVar56,auVar55);
        uVar49 = uVar49 & 0xf;
        auVar56 = vpblendmd_avx512vl(auVar74,auVar54);
        bVar15 = (bool)((byte)uVar49 & 1);
        auVar57._0_4_ = (uint)bVar15 * auVar56._0_4_ | (uint)!bVar15 * auVar55._0_4_;
        bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
        auVar57._4_4_ = (uint)bVar15 * auVar56._4_4_ | (uint)!bVar15 * auVar55._4_4_;
        bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
        auVar57._8_4_ = (uint)bVar15 * auVar56._8_4_ | (uint)!bVar15 * auVar55._8_4_;
        bVar15 = SUB81(uVar49 >> 3,0);
        auVar57._12_4_ = (uint)bVar15 * auVar56._12_4_ | (uint)!bVar15 * auVar55._12_4_;
        auVar74 = vmovdqa32_avx512vl(auVar74);
        bVar15 = (bool)((byte)uVar49 & 1);
        auVar58._0_4_ = (uint)bVar15 * auVar74._0_4_ | (uint)!bVar15 * auVar54._0_4_;
        bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar15 * auVar74._4_4_ | (uint)!bVar15 * auVar54._4_4_;
        bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar15 * auVar74._8_4_ | (uint)!bVar15 * auVar54._8_4_;
        bVar15 = SUB81(uVar49 >> 3,0);
        auVar58._12_4_ = (uint)bVar15 * auVar74._12_4_ | (uint)!bVar15 * auVar54._12_4_;
        auVar54 = vpshufd_avx(auVar57,0xaa);
        uVar38 = vpcmpgtd_avx512vl(auVar126,auVar54);
        uVar38 = uVar38 & 0xf;
        auVar74 = vpblendmd_avx512vl(auVar127,auVar57);
        bVar15 = (bool)((byte)uVar38 & 1);
        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
        uVar49 = CONCAT44((uint)bVar16 * auVar74._4_4_ | (uint)!bVar16 * auVar54._4_4_,
                          (uint)bVar15 * auVar74._0_4_ | (uint)!bVar15 * auVar54._0_4_);
        auVar54 = vmovdqa32_avx512vl(auVar127);
        bVar15 = (bool)((byte)uVar38 & 1);
        auVar59._0_4_ = (uint)bVar15 * auVar54._0_4_ | !bVar15 * auVar57._0_4_;
        bVar15 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar59._4_4_ = (uint)bVar15 * auVar54._4_4_ | !bVar15 * auVar57._4_4_;
        bVar15 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar59._8_4_ = (uint)bVar15 * auVar54._8_4_ | !bVar15 * auVar57._8_4_;
        bVar15 = SUB81(uVar38 >> 3,0);
        auVar59._12_4_ = (uint)bVar15 * auVar54._12_4_ | !bVar15 * auVar57._12_4_;
        auVar54 = vpshufd_avx(auVar59,0xaa);
        auVar74 = vpshufd_avx(auVar58,0xaa);
        uVar38 = vpcmpgtd_avx512vl(auVar54,auVar74);
        uVar38 = uVar38 & 0xf;
        auVar74 = vpblendmd_avx512vl(auVar59,auVar58);
        bVar15 = (bool)((byte)uVar38 & 1);
        auVar60._0_4_ = (uint)bVar15 * auVar74._0_4_ | (uint)!bVar15 * auVar54._0_4_;
        bVar15 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar60._4_4_ = (uint)bVar15 * auVar74._4_4_ | (uint)!bVar15 * auVar54._4_4_;
        bVar15 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar60._8_4_ = (uint)bVar15 * auVar74._8_4_ | (uint)!bVar15 * auVar54._8_4_;
        bVar15 = SUB81(uVar38 >> 3,0);
        auVar60._12_4_ = (uint)bVar15 * auVar74._12_4_ | (uint)!bVar15 * auVar54._12_4_;
        auVar54 = vmovdqa32_avx512vl(auVar59);
        bVar15 = (bool)((byte)uVar38 & 1);
        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar38 >> 2) & 1);
        bVar18 = SUB81(uVar38 >> 3,0);
        *(uint *)puVar35 = (uint)bVar15 * auVar54._0_4_ | !bVar15 * auVar58._0_4_;
        *(uint *)((long)puVar35 + 4) = (uint)bVar16 * auVar54._4_4_ | !bVar16 * auVar58._4_4_;
        *(uint *)(puVar35 + 1) = (uint)bVar17 * auVar54._8_4_ | !bVar17 * auVar58._8_4_;
        *(uint *)((long)puVar35 + 0xc) = (uint)bVar18 * auVar54._12_4_ | !bVar18 * auVar58._12_4_;
        *(undefined1 (*) [16])(puVar35 + 2) = auVar60;
        puVar35 = puVar35 + 4;
      }
      else {
        lVar27 = 0;
        for (; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
          lVar27 = lVar27 + 1;
        }
        uVar39 = *(uint *)(local_1260 + lVar27 * 4);
        auVar144._8_8_ = 0;
        auVar144._0_8_ = *(ulong *)(uVar38 + lVar27 * 8);
        auVar132 = vpunpcklqdq_avx(auVar144,ZEXT416(uVar39));
        uVar49 = vpcmpgtd_avx512vl(auVar56,auVar55);
        uVar49 = uVar49 & 0xf;
        auVar56 = vpblendmd_avx512vl(auVar74,auVar54);
        bVar15 = (bool)((byte)uVar49 & 1);
        auVar61._0_4_ = (uint)bVar15 * auVar56._0_4_ | (uint)!bVar15 * auVar55._0_4_;
        bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
        auVar61._4_4_ = (uint)bVar15 * auVar56._4_4_ | (uint)!bVar15 * auVar55._4_4_;
        bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
        auVar61._8_4_ = (uint)bVar15 * auVar56._8_4_ | (uint)!bVar15 * auVar55._8_4_;
        bVar15 = SUB81(uVar49 >> 3,0);
        auVar61._12_4_ = (uint)bVar15 * auVar56._12_4_ | (uint)!bVar15 * auVar55._12_4_;
        auVar74 = vmovdqa32_avx512vl(auVar74);
        bVar15 = (bool)((byte)uVar49 & 1);
        auVar62._0_4_ = (uint)bVar15 * auVar74._0_4_ | (uint)!bVar15 * auVar54._0_4_;
        bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
        auVar62._4_4_ = (uint)bVar15 * auVar74._4_4_ | (uint)!bVar15 * auVar54._4_4_;
        bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
        auVar62._8_4_ = (uint)bVar15 * auVar74._8_4_ | (uint)!bVar15 * auVar54._8_4_;
        bVar15 = SUB81(uVar49 >> 3,0);
        auVar62._12_4_ = (uint)bVar15 * auVar74._12_4_ | (uint)!bVar15 * auVar54._12_4_;
        auVar125._4_4_ = uVar39;
        auVar125._0_4_ = uVar39;
        auVar125._8_4_ = uVar39;
        auVar125._12_4_ = uVar39;
        auVar152 = ZEXT1664(auVar152._0_16_);
        uVar49 = vpcmpgtd_avx512vl(auVar125,auVar126);
        uVar49 = uVar49 & 0xf;
        auVar54 = vpblendmd_avx512vl(auVar132,auVar127);
        bVar15 = (bool)((byte)uVar49 & 1);
        auVar63._0_4_ = (uint)bVar15 * auVar54._0_4_ | !bVar15 * uVar39;
        bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
        auVar63._4_4_ = (uint)bVar15 * auVar54._4_4_ | !bVar15 * uVar39;
        bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
        auVar63._8_4_ = (uint)bVar15 * auVar54._8_4_ | !bVar15 * uVar39;
        bVar15 = SUB81(uVar49 >> 3,0);
        auVar63._12_4_ = (uint)bVar15 * auVar54._12_4_ | !bVar15 * uVar39;
        auVar54 = vmovdqa32_avx512vl(auVar132);
        bVar15 = (bool)((byte)uVar49 & 1);
        auVar64._0_4_ = (uint)bVar15 * auVar54._0_4_ | (uint)!bVar15 * auVar127._0_4_;
        bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
        auVar64._4_4_ = (uint)bVar15 * auVar54._4_4_ | (uint)!bVar15 * auVar127._4_4_;
        bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
        auVar64._8_4_ = (uint)bVar15 * auVar54._8_4_ | (uint)!bVar15 * auVar127._8_4_;
        bVar15 = SUB81(uVar49 >> 3,0);
        auVar64._12_4_ = (uint)bVar15 * auVar54._12_4_ | (uint)!bVar15 * auVar127._12_4_;
        auVar147 = ZEXT1664(local_1440);
        auVar54 = vpshufd_avx(auVar64,0xaa);
        auVar74 = vpshufd_avx(auVar62,0xaa);
        uVar49 = vpcmpgtd_avx512vl(auVar54,auVar74);
        uVar49 = uVar49 & 0xf;
        auVar74 = vpblendmd_avx512vl(auVar64,auVar62);
        bVar15 = (bool)((byte)uVar49 & 1);
        auVar65._0_4_ = (uint)bVar15 * auVar74._0_4_ | (uint)!bVar15 * auVar54._0_4_;
        bVar15 = (bool)((byte)(uVar49 >> 1) & 1);
        auVar65._4_4_ = (uint)bVar15 * auVar74._4_4_ | (uint)!bVar15 * auVar54._4_4_;
        bVar15 = (bool)((byte)(uVar49 >> 2) & 1);
        auVar65._8_4_ = (uint)bVar15 * auVar74._8_4_ | (uint)!bVar15 * auVar54._8_4_;
        bVar15 = SUB81(uVar49 >> 3,0);
        auVar65._12_4_ = (uint)bVar15 * auVar74._12_4_ | (uint)!bVar15 * auVar54._12_4_;
        auVar55 = vmovdqa32_avx512vl(auVar64);
        bVar15 = (bool)((byte)uVar49 & 1);
        bVar17 = (bool)((byte)(uVar49 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar49 >> 2) & 1);
        bVar20 = SUB81(uVar49 >> 3,0);
        auVar54 = vpshufd_avx(auVar63,0xaa);
        auVar74 = vpshufd_avx(auVar61,0xaa);
        uVar38 = vpcmpgtd_avx512vl(auVar54,auVar74);
        uVar38 = uVar38 & 0xf;
        auVar74 = vpblendmd_avx512vl(auVar63,auVar61);
        bVar16 = (bool)((byte)uVar38 & 1);
        bVar18 = (bool)((byte)(uVar38 >> 1) & 1);
        uVar49 = CONCAT44((uint)bVar18 * auVar74._4_4_ | (uint)!bVar18 * auVar54._4_4_,
                          (uint)bVar16 * auVar74._0_4_ | (uint)!bVar16 * auVar54._0_4_);
        auVar54 = vmovdqa32_avx512vl(auVar63);
        bVar16 = (bool)((byte)uVar38 & 1);
        auVar66._0_4_ = (uint)bVar16 * auVar54._0_4_ | !bVar16 * auVar61._0_4_;
        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar66._4_4_ = (uint)bVar16 * auVar54._4_4_ | !bVar16 * auVar61._4_4_;
        bVar16 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar66._8_4_ = (uint)bVar16 * auVar54._8_4_ | !bVar16 * auVar61._8_4_;
        bVar16 = SUB81(uVar38 >> 3,0);
        auVar66._12_4_ = (uint)bVar16 * auVar54._12_4_ | !bVar16 * auVar61._12_4_;
        auVar54 = vpshufd_avx(auVar66,0xaa);
        auVar74 = vpshufd_avx(auVar65,0xaa);
        uVar38 = vpcmpgtd_avx512vl(auVar74,auVar54);
        uVar38 = uVar38 & 0xf;
        auVar74 = vpblendmd_avx512vl(auVar65,auVar66);
        bVar16 = (bool)((byte)uVar38 & 1);
        auVar67._0_4_ = (uint)bVar16 * auVar74._0_4_ | (uint)!bVar16 * auVar54._0_4_;
        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar67._4_4_ = (uint)bVar16 * auVar74._4_4_ | (uint)!bVar16 * auVar54._4_4_;
        bVar16 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar67._8_4_ = (uint)bVar16 * auVar74._8_4_ | (uint)!bVar16 * auVar54._8_4_;
        bVar16 = SUB81(uVar38 >> 3,0);
        auVar67._12_4_ = (uint)bVar16 * auVar74._12_4_ | (uint)!bVar16 * auVar54._12_4_;
        auVar54 = vmovdqa32_avx512vl(auVar65);
        bVar16 = (bool)((byte)uVar38 & 1);
        auVar68._0_4_ = (uint)bVar16 * auVar54._0_4_ | !bVar16 * auVar66._0_4_;
        bVar16 = (bool)((byte)(uVar38 >> 1) & 1);
        auVar68._4_4_ = (uint)bVar16 * auVar54._4_4_ | !bVar16 * auVar66._4_4_;
        bVar16 = (bool)((byte)(uVar38 >> 2) & 1);
        auVar68._8_4_ = (uint)bVar16 * auVar54._8_4_ | !bVar16 * auVar66._8_4_;
        bVar16 = SUB81(uVar38 >> 3,0);
        auVar68._12_4_ = (uint)bVar16 * auVar54._12_4_ | !bVar16 * auVar66._12_4_;
        *(uint *)puVar35 = (uint)bVar15 * auVar55._0_4_ | !bVar15 * auVar62._0_4_;
        *(uint *)((long)puVar35 + 4) = (uint)bVar17 * auVar55._4_4_ | !bVar17 * auVar62._4_4_;
        *(uint *)(puVar35 + 1) = (uint)bVar19 * auVar55._8_4_ | !bVar19 * auVar62._8_4_;
        *(uint *)((long)puVar35 + 0xc) = (uint)bVar20 * auVar55._12_4_ | !bVar20 * auVar62._12_4_;
        *(undefined1 (*) [16])(puVar35 + 2) = auVar68;
        *(undefined1 (*) [16])(puVar35 + 4) = auVar67;
        puVar35 = puVar35 + 6;
      }
      auVar143 = ZEXT1664(local_1460);
    }
  }
  goto joined_r0x0075d827;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }